

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O1

void av1_warp_affine_avx2
               (int32_t *mat,uint8_t *ref,int width,int height,int stride,uint8_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,int16_t delta)

{
  long lVar1;
  int iVar2;
  int iVar3;
  WarpedFilterCoeff aWVar4 [8];
  CONV_BUF_TYPE *pCVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  byte bVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  long lVar48;
  undefined1 (*pauVar49) [32];
  int iVar50;
  int iVar51;
  int iVar52;
  ulong uVar53;
  int iVar54;
  uint uVar55;
  uint uVar56;
  int iVar57;
  uint uVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  uint uVar66;
  long lVar67;
  int iVar68;
  uint uVar69;
  int iVar70;
  int iVar71;
  uint uVar72;
  long lVar73;
  int iVar74;
  int iVar75;
  ulong uVar76;
  int iVar77;
  uint uVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  ulong uVar82;
  uint uVar83;
  int iVar84;
  uint uVar85;
  long lVar86;
  int iVar87;
  int iVar88;
  uint8_t *puVar89;
  int iVar90;
  uint uVar91;
  int iVar92;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined2 uVar93;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar132 [32];
  short sVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  short sVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [64];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [64];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar244 [64];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar251 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  __m256i horz_out [8];
  uint8_t *local_550;
  undefined1 local_4d0 [16];
  long local_430;
  undefined1 local_400 [32];
  uint8_t *local_3d8;
  uint8_t *local_340;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [320];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [128];
  undefined1 local_80 [32];
  undefined1 auVar101 [32];
  undefined1 auVar122 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar145 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar163 [32];
  undefined1 auVar168 [32];
  undefined1 auVar200 [32];
  undefined1 auVar209 [32];
  undefined1 auVar218 [32];
  undefined1 auVar237 [32];
  undefined1 auVar243 [32];
  undefined1 auVar250 [32];
  
  uVar69 = conv_params->round_0;
  if (conv_params->is_compound == 0) {
    uVar83 = 0xe - uVar69;
  }
  else {
    uVar83 = conv_params->round_1;
  }
  bVar23 = (byte)uVar69;
  bVar42 = (0x16 - bVar23) - (char)conv_params->round_1;
  uVar56 = 0xe - (uVar69 + conv_params->round_1);
  if (conv_params->is_compound == 1) {
    iVar74 = 1 << (0x16 - bVar23 & 0x1f);
  }
  else {
    iVar74 = -1 << ((byte)uVar83 + 7 & 0x1f);
  }
  iVar74 = ((1 << ((byte)uVar83 & 0x1f)) >> 1) + iVar74;
  if (0 < p_height) {
    sVar133 = (short)((uint)(1 << (bVar23 & 0x1f)) >> 1) + 0x4000;
    sVar154 = (short)(-1 << (bVar42 - 1 & 0x1f)) + (short)(-1 << (bVar42 & 0x1f));
    auVar228 = ZEXT464(uVar69);
    iVar77 = (int)alpha;
    iVar87 = (int)beta;
    bVar42 = 7 - bVar23;
    iVar2 = height + -1;
    iVar90 = (0x10000 << (0xe - bVar23 & 0x1f)) >> 0x10;
    iVar57 = 1 << (0xe - bVar23 & 0x1f);
    iVar50 = (0x10000 << (bVar42 & 0x1f)) >> 0x10;
    iVar54 = (int)gamma;
    iVar84 = (int)delta;
    iVar6 = iVar77 * 7;
    iVar26 = iVar6 + 0x10200 + iVar87 * -3;
    iVar14 = iVar77 * 2;
    iVar7 = iVar77 * 6;
    iVar27 = iVar7 + 0x10200 + iVar87 * -3;
    iVar8 = iVar77 * 5;
    iVar28 = iVar8 + 0x10200 + iVar87 * -3;
    iVar43 = iVar77 * 4;
    iVar29 = iVar43 + 0x10200 + iVar87 * -3;
    iVar9 = iVar77 * 3;
    uVar30 = iVar9 + 0x10200 + iVar87 * -3;
    iVar31 = iVar14 + 0x10200 + iVar87 * -3;
    iVar32 = iVar77 + 0x10200 + iVar87 * -3;
    iVar33 = iVar87 * -3 + 0x10200;
    uVar93 = (undefined2)conv_params->fwd_offset;
    auVar97._2_2_ = uVar93;
    auVar97._0_2_ = uVar93;
    auVar97._4_2_ = uVar93;
    auVar97._6_2_ = uVar93;
    auVar97._8_2_ = uVar93;
    auVar97._10_2_ = uVar93;
    auVar97._12_2_ = uVar93;
    auVar97._14_2_ = uVar93;
    auVar97._16_2_ = uVar93;
    auVar97._18_2_ = uVar93;
    auVar97._20_2_ = uVar93;
    auVar97._22_2_ = uVar93;
    auVar97._24_2_ = uVar93;
    auVar97._26_2_ = uVar93;
    auVar97._28_2_ = uVar93;
    auVar97._30_2_ = uVar93;
    uVar93 = (undefined2)conv_params->bck_offset;
    auVar119._2_2_ = uVar93;
    auVar119._0_2_ = uVar93;
    auVar119._4_2_ = uVar93;
    auVar119._6_2_ = uVar93;
    auVar119._8_2_ = uVar93;
    auVar119._10_2_ = uVar93;
    auVar119._12_2_ = uVar93;
    auVar119._14_2_ = uVar93;
    auVar119._16_2_ = uVar93;
    auVar119._18_2_ = uVar93;
    auVar119._20_2_ = uVar93;
    auVar119._22_2_ = uVar93;
    auVar119._24_2_ = uVar93;
    auVar119._26_2_ = uVar93;
    auVar119._28_2_ = uVar93;
    auVar119._30_2_ = uVar93;
    auVar119 = vpunpcklwd_avx2(auVar97,auVar119);
    local_80._2_2_ = sVar133;
    local_80._0_2_ = sVar133;
    local_80._4_2_ = sVar133;
    local_80._6_2_ = sVar133;
    local_80._8_2_ = sVar133;
    local_80._10_2_ = sVar133;
    local_80._12_2_ = sVar133;
    local_80._14_2_ = sVar133;
    local_80._16_2_ = sVar133;
    local_80._18_2_ = sVar133;
    local_80._20_2_ = sVar133;
    local_80._22_2_ = sVar133;
    local_80._24_2_ = sVar133;
    local_80._26_2_ = sVar133;
    local_80._28_2_ = sVar133;
    local_80._30_2_ = sVar133;
    auVar231 = ZEXT3264(local_80);
    auVar199._2_2_ = sVar154;
    auVar199._0_2_ = sVar154;
    auVar199._4_2_ = sVar154;
    auVar199._6_2_ = sVar154;
    auVar199._8_2_ = sVar154;
    auVar199._10_2_ = sVar154;
    auVar199._12_2_ = sVar154;
    auVar199._14_2_ = sVar154;
    auVar199._16_2_ = sVar154;
    auVar199._18_2_ = sVar154;
    auVar199._20_2_ = sVar154;
    auVar199._22_2_ = sVar154;
    auVar199._24_2_ = sVar154;
    auVar199._26_2_ = sVar154;
    auVar199._28_2_ = sVar154;
    auVar199._30_2_ = sVar154;
    uVar93 = (undefined2)((uint)(1 << ((byte)uVar56 & 0x1f)) >> 1);
    auVar181._2_2_ = uVar93;
    auVar181._0_2_ = uVar93;
    auVar181._4_2_ = uVar93;
    auVar181._6_2_ = uVar93;
    auVar181._8_2_ = uVar93;
    auVar181._10_2_ = uVar93;
    auVar181._12_2_ = uVar93;
    auVar181._14_2_ = uVar93;
    auVar181._16_2_ = uVar93;
    auVar181._18_2_ = uVar93;
    auVar181._20_2_ = uVar93;
    auVar181._22_2_ = uVar93;
    auVar181._24_2_ = uVar93;
    auVar181._26_2_ = uVar93;
    auVar181._28_2_ = uVar93;
    auVar181._30_2_ = uVar93;
    auVar97 = vpaddw_avx2(auVar199,auVar181);
    iVar10 = iVar54 * 7;
    iVar15 = iVar87 * 2;
    iVar3 = iVar6 + 0x10200 + iVar87 * -2;
    iVar68 = iVar7 + 0x10200 + iVar87 * -2;
    iVar63 = iVar8 + 0x10200 + iVar87 * -2;
    iVar60 = iVar43 + 0x10200 + iVar87 * -2;
    iVar44 = iVar9 + 0x10200 + iVar87 * -2;
    uVar58 = iVar14 + 0x10200 + iVar87 * -2;
    uVar78 = iVar77 + 0x10200 + iVar87 * -2;
    iVar45 = iVar87 * -2 + 0x10200;
    auVar238 = ZEXT3264(CONCAT1616(_DAT_00563ce0,_DAT_00563ce0));
    auVar244 = ZEXT3264(CONCAT1616(_DAT_00564440,_DAT_00564440));
    auVar251 = ZEXT3264(CONCAT1616(_DAT_00564450,_DAT_00564450));
    auVar256 = ZEXT3264(CONCAT1616(_DAT_00564460,_DAT_00564460));
    iVar34 = width + -1;
    iVar11 = iVar54 * 6;
    iVar12 = iVar54 * 3;
    iVar13 = iVar54 * 5;
    lVar67 = (long)p_stride;
    uVar37 = (ulong)(uint)p_height;
    lVar1 = uVar37 + 5;
    local_340 = pred + lVar67;
    uVar82 = 0;
    auVar225 = ZEXT416(uVar69);
    local_3d8 = pred;
    do {
      iVar79 = 8;
      if (p_height < 8) {
        iVar79 = p_height;
      }
      iVar92 = 2;
      if (2 < iVar79) {
        iVar92 = iVar79;
      }
      iVar47 = iVar79 + -2;
      if (iVar79 + -2 < -5) {
        iVar47 = -6;
      }
      if (0 < p_width) {
        uVar76 = (ulong)(iVar92 - 1U & 0xfffffffe);
        iVar79 = (int)uVar82;
        uVar53 = (ulong)(iVar47 + 7U & 0xfffffffe);
        lVar38 = (long)(p_row + 4 + iVar79 << ((byte)subsampling_y & 0x1f));
        lVar39 = uVar37 - uVar82;
        local_550 = local_340;
        lVar48 = 0;
        puVar89 = local_3d8;
        do {
          auVar181 = local_2c0._0_32_;
          auVar199 = local_2e0;
          auVar121 = auVar231._0_32_;
          auVar255 = auVar256._0_32_;
          auVar249 = auVar251._0_32_;
          auVar182 = auVar244._0_32_;
          auVar236 = auVar238._0_32_;
          auVar96 = auVar228._0_16_;
          lVar40 = (long)(p_col + 4 + (int)lVar48 << ((byte)subsampling_x & 0x1f));
          lVar86 = (long)*mat + mat[3] * lVar38 + mat[2] * lVar40 >> ((byte)subsampling_x & 0x3f);
          lVar40 = (long)mat[1] + mat[5] * lVar38 + mat[4] * lVar40 >> ((byte)subsampling_y & 0x3f);
          uVar69 = (uint)((ulong)lVar86 >> 0x10);
          iVar92 = (int)((ulong)lVar40 >> 0x10);
          if ((int)uVar69 < -6) {
            if (lVar1 < (long)uVar82) {
              iVar47 = -7;
              lVar73 = 0;
            }
            else {
              uVar41 = 0xfffffffffffffffe;
              pauVar49 = &local_180;
              lVar73 = 0;
              do {
                iVar61 = iVar92 + (int)uVar41 + -5;
                iVar47 = iVar2;
                if (iVar61 < iVar2) {
                  iVar47 = iVar61;
                }
                if (iVar61 < 0) {
                  iVar47 = 0;
                }
                iVar64 = iVar92 + (int)uVar41 + -4;
                if (iVar2 <= iVar64) {
                  iVar64 = iVar2;
                }
                if (iVar61 < -1) {
                  iVar64 = 0;
                }
                uVar93 = (undefined2)((uint)ref[iVar47 * stride] * iVar50 + iVar90);
                auVar120._0_2_ = (undefined2)((uint)ref[iVar64 * stride] * iVar50 + iVar90);
                auVar120._2_2_ = auVar120._0_2_;
                auVar120._4_2_ = auVar120._0_2_;
                auVar120._6_2_ = auVar120._0_2_;
                auVar120._8_2_ = auVar120._0_2_;
                auVar120._10_2_ = auVar120._0_2_;
                auVar120._12_2_ = auVar120._0_2_;
                auVar120._14_2_ = auVar120._0_2_;
                auVar120._16_2_ = auVar120._0_2_;
                auVar120._18_2_ = auVar120._0_2_;
                auVar120._20_2_ = auVar120._0_2_;
                auVar120._22_2_ = auVar120._0_2_;
                auVar120._24_2_ = auVar120._0_2_;
                auVar120._26_2_ = auVar120._0_2_;
                auVar120._28_2_ = auVar120._0_2_;
                auVar120._30_2_ = auVar120._0_2_;
                auVar199 = vpblendd_avx2(ZEXT1632(CONCAT214(uVar93,CONCAT212(uVar93,CONCAT210(uVar93
                                                  ,CONCAT28(uVar93,CONCAT26(uVar93,CONCAT24(uVar93,
                                                  CONCAT22(uVar93,uVar93)))))))),auVar120,0xf0);
                *pauVar49 = auVar199;
                lVar73 = lVar73 + 1;
                pauVar49 = pauVar49 + 1;
                uVar41 = uVar41 + 2;
              } while (uVar53 != uVar41);
              iVar47 = (int)uVar41 + -5;
            }
            iVar47 = iVar47 + iVar92;
            iVar92 = iVar2;
            if (iVar47 < iVar2) {
              iVar92 = iVar47;
            }
            if (iVar47 < 0) {
              iVar92 = 0;
            }
            auVar98._0_2_ = (undefined2)(((uint)ref[iVar92 * stride] << (bVar42 & 0x1f)) + iVar57);
            auVar98._2_2_ = auVar98._0_2_;
            auVar98._4_2_ = auVar98._0_2_;
            auVar98._6_2_ = auVar98._0_2_;
            auVar98._8_2_ = auVar98._0_2_;
            auVar98._10_2_ = auVar98._0_2_;
            auVar98._12_2_ = auVar98._0_2_;
            auVar98._14_2_ = auVar98._0_2_;
            auVar98._16_2_ = auVar98._0_2_;
            auVar98._18_2_ = auVar98._0_2_;
            auVar98._20_2_ = auVar98._0_2_;
            auVar98._22_2_ = auVar98._0_2_;
            auVar98._24_2_ = auVar98._0_2_;
            auVar98._26_2_ = auVar98._0_2_;
            auVar98._28_2_ = auVar98._0_2_;
            auVar98._30_2_ = auVar98._0_2_;
LAB_0045fb5f:
            *(undefined1 (*) [32])(local_180 + lVar73 * 0x20) = auVar98;
          }
          else if ((int)uVar69 < width + 6) {
            uVar85 = ((uint)lVar86 & 0xfffc) + (iVar87 + iVar77) * -4 & 0xffffffc0;
            uVar55 = uVar85 + 0x10200;
            if (width < (int)(uVar69 + 9) || (int)uVar69 < 7) {
              uVar46 = (uVar69 - width) + 8;
              if (lVar1 < (long)uVar82) {
                iVar47 = -7;
                local_430 = 0;
              }
              else {
                uVar41 = 0xfffffffffffffffe;
                pauVar49 = &local_180;
                local_430 = 0;
                iVar75 = iVar29;
                iVar47 = iVar3;
                iVar61 = iVar33;
                iVar64 = iVar26;
                iVar59 = iVar32;
                iVar62 = iVar27;
                uVar66 = uVar30;
                uVar72 = uVar78;
                iVar81 = iVar31;
                iVar88 = iVar28;
                uVar91 = uVar58;
                iVar51 = iVar44;
                iVar71 = iVar60;
                iVar80 = iVar63;
                iVar65 = iVar68;
                iVar52 = iVar45;
                do {
                  auVar121 = local_80;
                  auVar24._24_8_ = 0;
                  auVar24._0_24_ = local_2e0._8_24_;
                  local_2e0 = auVar24 << 0x40;
                  auVar25._24_8_ = 0;
                  auVar25._0_24_ = local_2c0._8_24_;
                  local_2c0._0_32_ = auVar25 << 0x40;
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = local_4d0._8_8_;
                  local_4d0 = auVar96 << 0x40;
                  iVar70 = iVar92 + (int)uVar41 + -5;
                  iVar36 = iVar2;
                  if (iVar70 < iVar2) {
                    iVar36 = iVar70;
                  }
                  if (iVar70 < 0) {
                    iVar36 = 0;
                  }
                  iVar35 = iVar92 + (int)uVar41 + -4;
                  if (iVar2 <= iVar35) {
                    iVar35 = iVar2;
                  }
                  if (iVar70 < -1) {
                    iVar35 = 0;
                  }
                  auVar96 = *(undefined1 (*) [16])
                             (ref + (long)(iVar36 * stride) + (long)(int)uVar69 + -7);
                  auVar94 = *(undefined1 (*) [16])
                             (ref + (long)(iVar35 * stride) + (long)(int)uVar69 + -7);
                  if ((int)uVar69 < 7) {
                    auVar96 = vpshufb_avx(auVar96,(undefined1  [16])warp_pad_left[6 - uVar69]);
                    auVar94 = vpshufb_avx(auVar94,(undefined1  [16])warp_pad_left[6 - uVar69]);
                  }
                  if (-1 < (int)uVar46) {
                    auVar96 = vpshufb_avx(auVar96,(undefined1  [16])warp_pad_right[uVar46]);
                    auVar94 = vpshufb_avx(auVar94,(undefined1  [16])warp_pad_right[uVar46]);
                  }
                  auVar99._0_16_ = ZEXT116(0) * auVar94 + ZEXT116(1) * auVar96;
                  auVar99._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar94;
                  auVar111._8_8_ = 0;
                  auVar111._0_8_ = av1_filter_8bit[iVar52 + uVar85 >> 10];
                  auVar134._8_8_ = 0;
                  auVar134._0_8_ = av1_filter_8bit[iVar61 + uVar85 >> 10];
                  auVar122._0_16_ = ZEXT116(0) * auVar111 + ZEXT116(1) * auVar134;
                  auVar122._16_16_ = ZEXT116(1) * auVar111;
                  auVar155._8_8_ = 0;
                  auVar155._0_8_ = av1_filter_8bit[uVar72 + uVar85 >> 10];
                  auVar170._8_8_ = 0;
                  auVar170._0_8_ = av1_filter_8bit[iVar59 + uVar85 >> 10];
                  auVar163._0_16_ = ZEXT116(0) * auVar155 + ZEXT116(1) * auVar170;
                  auVar163._16_16_ = ZEXT116(1) * auVar155;
                  auVar190._8_8_ = 0;
                  auVar190._0_8_ = av1_filter_8bit[uVar91 + uVar85 >> 10];
                  auVar203._8_8_ = 0;
                  auVar203._0_8_ = av1_filter_8bit[iVar81 + uVar85 >> 10];
                  auVar175._0_16_ = ZEXT116(0) * auVar190 + ZEXT116(1) * auVar203;
                  auVar175._16_16_ = ZEXT116(1) * auVar190;
                  auVar199 = vpunpcklwd_avx2(auVar122,auVar175);
                  auVar212._8_8_ = 0;
                  auVar212._0_8_ = av1_filter_8bit[iVar51 + uVar85 >> 10];
                  auVar220._8_8_ = 0;
                  auVar220._0_8_ = av1_filter_8bit[uVar66 + uVar85 >> 10];
                  auVar176._0_16_ = ZEXT116(0) * auVar212 + ZEXT116(1) * auVar220;
                  auVar176._16_16_ = ZEXT116(1) * auVar212;
                  auVar181 = vpunpcklwd_avx2(auVar163,auVar176);
                  auVar226._8_8_ = 0;
                  auVar226._0_8_ = av1_filter_8bit[iVar71 + uVar85 >> 10];
                  auVar229._8_8_ = 0;
                  auVar229._0_8_ = av1_filter_8bit[iVar75 + uVar85 >> 10];
                  auVar177._0_16_ = ZEXT116(0) * auVar226 + ZEXT116(1) * auVar229;
                  auVar177._16_16_ = ZEXT116(1) * auVar226;
                  auVar232._8_8_ = 0;
                  auVar232._0_8_ = av1_filter_8bit[iVar80 + uVar85 >> 10];
                  auVar239._8_8_ = 0;
                  auVar239._0_8_ = av1_filter_8bit[iVar88 + uVar85 >> 10];
                  auVar197._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar239;
                  auVar197._16_16_ = ZEXT116(1) * auVar232;
                  auVar245._8_8_ = 0;
                  auVar245._0_8_ = av1_filter_8bit[iVar65 + uVar85 >> 10];
                  auVar252._8_8_ = 0;
                  auVar252._0_8_ = av1_filter_8bit[iVar62 + uVar85 >> 10];
                  auVar208._0_16_ = ZEXT116(0) * auVar245 + ZEXT116(1) * auVar252;
                  auVar208._16_16_ = ZEXT116(1) * auVar245;
                  auVar236 = vpunpcklwd_avx2(auVar177,auVar208);
                  auVar257._8_8_ = 0;
                  auVar257._0_8_ = av1_filter_8bit[iVar47 + uVar85 >> 10];
                  auVar135._8_8_ = 0;
                  auVar135._0_8_ = av1_filter_8bit[iVar64 + uVar85 >> 10];
                  auVar145._0_16_ = ZEXT116(0) * auVar257 + ZEXT116(1) * auVar135;
                  auVar145._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar257;
                  auVar182 = vpunpcklwd_avx2(auVar197,auVar145);
                  auVar249 = vpunpckldq_avx2(auVar199,auVar236);
                  auVar199 = vpunpckhdq_avx2(auVar199,auVar236);
                  auVar236 = vpunpckldq_avx2(auVar181,auVar182);
                  auVar181 = vpunpckhdq_avx2(auVar181,auVar182);
                  auVar182 = vpunpcklqdq_avx2(auVar249,auVar236);
                  auVar249 = vpunpckhqdq_avx2(auVar249,auVar236);
                  auVar131 = vpunpcklqdq_avx2(auVar199,auVar181);
                  auVar101 = vpunpckhqdq_avx2(auVar199,auVar181);
                  auVar236._16_16_ = _DAT_00563ce0;
                  auVar236._0_16_ = _DAT_00563ce0;
                  auVar199 = vpshufb_avx2(auVar99,auVar236);
                  auVar181 = vpmaddubsw_avx2(auVar199,auVar182);
                  auVar182._16_16_ = _DAT_00564440;
                  auVar182._0_16_ = _DAT_00564440;
                  auVar199 = vpshufb_avx2(auVar99,auVar182);
                  auVar199 = vpmaddubsw_avx2(auVar199,auVar249);
                  auVar249._16_16_ = _DAT_00564450;
                  auVar249._0_16_ = _DAT_00564450;
                  auVar255 = vpshufb_avx2(auVar99,auVar249);
                  auVar255 = vpmaddubsw_avx2(auVar255,auVar131);
                  auVar199 = vpaddw_avx2(auVar199,auVar255);
                  auVar255._16_16_ = _DAT_00564460;
                  auVar255._0_16_ = _DAT_00564460;
                  auVar131 = vpshufb_avx2(auVar99,auVar255);
                  auVar131 = vpmaddubsw_avx2(auVar131,auVar101);
                  auVar181 = vpaddw_avx2(local_80,auVar181);
                  auVar199 = vpaddw_avx2(auVar181,auVar199);
                  auVar199 = vpaddw_avx2(auVar199,auVar131);
                  auVar199 = vpsrlw_avx2(auVar199,auVar225);
                  *pauVar49 = auVar199;
                  local_430 = local_430 + 1;
                  pauVar49 = pauVar49 + 1;
                  uVar41 = uVar41 + 2;
                  iVar47 = iVar47 + iVar15;
                  iVar65 = iVar65 + iVar15;
                  iVar80 = iVar80 + iVar15;
                  iVar71 = iVar71 + iVar15;
                  iVar51 = iVar51 + iVar15;
                  uVar91 = uVar91 + iVar15;
                  uVar72 = uVar72 + iVar15;
                  iVar52 = iVar52 + iVar15;
                  iVar64 = iVar64 + iVar15;
                  iVar62 = iVar62 + iVar15;
                  iVar88 = iVar88 + iVar15;
                  iVar75 = iVar75 + iVar15;
                  uVar66 = uVar66 + iVar15;
                  iVar81 = iVar81 + iVar15;
                  iVar59 = iVar59 + iVar15;
                  iVar61 = iVar61 + iVar15;
                } while (uVar53 != uVar41);
                iVar47 = (int)uVar41 + -5;
                auVar96 = auVar225;
              }
              iVar92 = iVar47 + iVar92;
              iVar61 = iVar2;
              if (iVar92 < iVar2) {
                iVar61 = iVar92;
              }
              if (iVar92 < 0) {
                iVar61 = 0;
              }
              auVar94 = *(undefined1 (*) [16])
                         (ref + (long)(int)uVar69 + -7 + (long)(iVar61 * stride));
              if ((int)uVar69 < 7) {
                auVar94 = vpshufb_avx(auVar94,(undefined1  [16])warp_pad_left[6 - uVar69]);
              }
              if (-1 < (int)uVar46) {
                auVar94 = vpshufb_avx(auVar94,(undefined1  [16])warp_pad_right[uVar46]);
              }
              iVar92 = (iVar47 + 4) * iVar87 + uVar55;
              auVar100._0_16_ = ZEXT116(0) * auVar94 + ZEXT116(1) * auVar94;
              auVar100._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar94;
              auVar112._8_8_ = 0;
              auVar112._0_8_ = av1_filter_8bit[iVar92 >> 10];
              auVar156._8_8_ = 0;
              auVar156._0_8_ = av1_filter_8bit[iVar14 + iVar92 >> 10];
              auVar94 = vpunpcklwd_avx(auVar112,auVar156);
              auVar136._8_8_ = 0;
              auVar136._0_8_ = av1_filter_8bit[iVar77 + iVar92 >> 10];
              auVar157._8_8_ = 0;
              auVar157._0_8_ = av1_filter_8bit[iVar9 + iVar92 >> 10];
              auVar114 = vpunpcklwd_avx(auVar136,auVar157);
              auVar158._8_8_ = 0;
              auVar158._0_8_ = av1_filter_8bit[iVar43 + iVar92 >> 10];
              auVar191._8_8_ = 0;
              auVar191._0_8_ = av1_filter_8bit[iVar7 + iVar92 >> 10];
              auVar138 = vpunpcklwd_avx(auVar158,auVar191);
              auVar171._8_8_ = 0;
              auVar171._0_8_ = av1_filter_8bit[iVar8 + iVar92 >> 10];
              auVar192._8_8_ = 0;
              auVar192._0_8_ = av1_filter_8bit[iVar92 + iVar6 >> 10];
              auVar115 = vpunpcklwd_avx(auVar171,auVar192);
              auVar139 = vpunpckldq_avx(auVar94,auVar138);
              auVar94 = vpunpckhdq_avx(auVar94,auVar138);
              auVar138 = vpunpckldq_avx(auVar114,auVar115);
              auVar114 = vpunpckhdq_avx(auVar114,auVar115);
              auVar115 = vpunpcklqdq_avx(auVar139,auVar138);
              auVar178._0_16_ = ZEXT116(0) * auVar100._0_16_ + ZEXT116(1) * auVar115;
              auVar178._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100._0_16_;
              auVar138 = vpunpckhqdq_avx(auVar139,auVar138);
              auVar164._0_16_ = ZEXT116(0) * auVar100._0_16_ + ZEXT116(1) * auVar138;
              auVar164._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100._0_16_;
              auVar138 = vpunpcklqdq_avx(auVar94,auVar114);
              auVar198._0_16_ = ZEXT116(0) * auVar100._0_16_ + ZEXT116(1) * auVar138;
              auVar198._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100._0_16_;
              auVar94 = vpunpckhqdq_avx(auVar94,auVar114);
              auVar123._0_16_ = ZEXT116(0) * auVar100._0_16_ + ZEXT116(1) * auVar94;
              auVar123._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100._0_16_;
              auVar199 = vpshufb_avx2(auVar100,auVar236);
              auVar181 = vpmaddubsw_avx2(auVar199,auVar178);
              auVar199 = vpshufb_avx2(auVar100,auVar182);
              auVar199 = vpmaddubsw_avx2(auVar199,auVar164);
              auVar236 = vpshufb_avx2(auVar100,auVar249);
              auVar236 = vpmaddubsw_avx2(auVar236,auVar198);
              auVar199 = vpaddw_avx2(auVar199,auVar236);
              auVar236 = vpshufb_avx2(auVar100,auVar255);
              auVar236 = vpmaddubsw_avx2(auVar236,auVar123);
              auVar181 = vpaddw_avx2(auVar121,auVar181);
              auVar199 = vpaddw_avx2(auVar181,auVar199);
              auVar199 = vpaddw_avx2(auVar199,auVar236);
              auVar199 = vpsrlw_avx2(auVar199,auVar96);
              *(undefined1 (*) [32])(local_180 + local_430 * 0x20) = auVar199;
            }
            else {
              if (beta == 0 && alpha == 0) {
                auVar131 = vpermq_avx2(ZEXT832((ulong)av1_filter_8bit[uVar55 >> 10]),0x44);
                auVar94._0_2_ = SUB82(av1_filter_8bit[uVar55 >> 10],0);
                auVar94._2_2_ = auVar94._0_2_;
                auVar94._4_2_ = auVar94._0_2_;
                auVar94._6_2_ = auVar94._0_2_;
                auVar94._8_2_ = auVar94._0_2_;
                auVar94._10_2_ = auVar94._0_2_;
                auVar94._12_2_ = auVar94._0_2_;
                auVar94._14_2_ = auVar94._0_2_;
                auVar101._16_2_ = auVar94._0_2_;
                auVar101._0_16_ = auVar94;
                auVar101._18_2_ = auVar94._0_2_;
                auVar101._20_2_ = auVar94._0_2_;
                auVar101._22_2_ = auVar94._0_2_;
                auVar101._24_2_ = auVar94._0_2_;
                auVar101._26_2_ = auVar94._0_2_;
                auVar101._28_2_ = auVar94._0_2_;
                auVar101._30_2_ = auVar94._0_2_;
                auVar199 = vpshuflw_avx2(auVar131,0x55);
                auVar199 = vpshufd_avx2(auVar199,0);
                auVar181 = vpshuflw_avx2(auVar131,0xaa);
                auVar181 = vpshufd_avx2(auVar181,0);
                auVar131 = vpshuflw_avx2(auVar131,0xff);
                auVar131 = vpshufd_avx2(auVar131,0);
                if (lVar39 < -5) {
                  iVar47 = -7;
                  lVar73 = 0;
                }
                else {
                  lVar86 = (ulong)(uVar69 & 0x7fffffff) - 7;
                  uVar41 = 0xfffffffffffffffe;
                  pauVar49 = &local_180;
                  lVar73 = 0;
                  do {
                    iVar61 = iVar92 + (int)uVar41 + -5;
                    iVar47 = iVar2;
                    if (iVar61 < iVar2) {
                      iVar47 = iVar61;
                    }
                    if (iVar61 < 0) {
                      iVar47 = 0;
                    }
                    iVar64 = iVar92 + (int)uVar41 + -4;
                    if (iVar2 <= iVar64) {
                      iVar64 = iVar2;
                    }
                    if (iVar61 < -1) {
                      iVar64 = 0;
                    }
                    auVar179._0_16_ =
                         ZEXT116(0) * *(undefined1 (*) [16])(ref + iVar64 * stride + lVar86) +
                         ZEXT116(1) * *(undefined1 (*) [16])(ref + iVar47 * stride + lVar86);
                    auVar179._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                         ZEXT116(1) * *(undefined1 (*) [16])(ref + iVar64 * stride + lVar86);
                    auVar180 = vpshufb_avx2(auVar179,auVar236);
                    auVar103 = vpshufb_avx2(auVar179,auVar182);
                    auVar125 = vpshufb_avx2(auVar179,auVar249);
                    auVar104 = vpshufb_avx2(auVar179,auVar255);
                    auVar179 = vpmaddubsw_avx2(auVar180,auVar101);
                    auVar180 = vpmaddubsw_avx2(auVar103,auVar199);
                    auVar103 = vpmaddubsw_avx2(auVar125,auVar181);
                    auVar180 = vpaddw_avx2(auVar180,auVar103);
                    auVar103 = vpmaddubsw_avx2(auVar104,auVar131);
                    auVar179 = vpaddw_avx2(auVar121,auVar179);
                    auVar180 = vpaddw_avx2(auVar179,auVar180);
                    auVar180 = vpaddw_avx2(auVar180,auVar103);
                    auVar180 = vpsrlw_avx2(auVar180,auVar96);
                    *pauVar49 = auVar180;
                    lVar73 = lVar73 + 1;
                    uVar41 = uVar41 + 2;
                    pauVar49 = pauVar49 + 1;
                  } while (uVar53 != uVar41);
                  iVar47 = (int)uVar41 + -5;
                }
                iVar47 = iVar47 + iVar92;
                iVar92 = iVar2;
                if (iVar47 < iVar2) {
                  iVar92 = iVar47;
                }
                if (iVar47 < 0) {
                  iVar92 = 0;
                }
                auVar180._0_16_ =
                     ZEXT116(0) * auVar94 +
                     ZEXT116(1) *
                     *(undefined1 (*) [16])
                      (ref + ((ulong)(uVar69 & 0x7fffffff) - 7) + (long)(iVar92 * stride));
                auVar180._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar94;
                auVar236 = vpshufb_avx2(auVar180,auVar236);
                auVar182 = vpshufb_avx2(auVar180,auVar182);
                auVar249 = vpshufb_avx2(auVar180,auVar249);
                auVar255 = vpshufb_avx2(auVar180,auVar255);
                auVar236 = vpmaddubsw_avx2(auVar236,auVar101);
                auVar199 = vpmaddubsw_avx2(auVar182,auVar199);
                auVar181 = vpmaddubsw_avx2(auVar249,auVar181);
                auVar199 = vpaddw_avx2(auVar199,auVar181);
                auVar182 = vpmaddubsw_avx2(auVar255,auVar131);
                auVar181 = vpaddw_avx2(auVar121,auVar236);
                auVar199 = vpaddw_avx2(auVar181,auVar199);
                auVar199 = vpaddw_avx2(auVar199,auVar182);
LAB_00461b53:
                auVar98 = vpsrlw_avx2(auVar199,auVar96);
                goto LAB_0045fb5f;
              }
              if (alpha == 0 && beta != 0) {
                if (lVar39 < -5) {
                  iVar47 = -7;
                  lVar86 = 0;
                }
                else {
                  local_4d0._0_8_ = ref + ((ulong)(uVar69 & 0x7fffffff) - 7);
                  iVar47 = iVar45 + uVar85;
                  iVar61 = uVar85 + iVar33;
                  uVar41 = 0xfffffffffffffffe;
                  pauVar49 = &local_180;
                  lVar86 = 0;
                  do {
                    iVar59 = iVar92 + (int)uVar41 + -5;
                    iVar64 = iVar2;
                    if (iVar59 < iVar2) {
                      iVar64 = iVar59;
                    }
                    if (iVar59 < 0) {
                      iVar64 = 0;
                    }
                    iVar62 = iVar92 + (int)uVar41 + -4;
                    if (iVar2 <= iVar62) {
                      iVar62 = iVar2;
                    }
                    if (iVar59 < -1) {
                      iVar62 = 0;
                    }
                    auVar103._0_16_ =
                         ZEXT116(0) *
                         *(undefined1 (*) [16])(local_4d0._0_8_ + (long)(iVar62 * stride)) +
                         ZEXT116(1) *
                         *(undefined1 (*) [16])(local_4d0._0_8_ + (long)(iVar64 * stride));
                    auVar103._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                         ZEXT116(1) *
                         *(undefined1 (*) [16])(local_4d0._0_8_ + (long)(iVar62 * stride));
                    auVar138._8_8_ = 0;
                    auVar138._0_8_ = av1_filter_8bit[iVar47 >> 10];
                    auVar114._8_8_ = 0;
                    auVar114._0_8_ = av1_filter_8bit[iVar61 >> 10];
                    auVar125._0_16_ = ZEXT116(0) * auVar138 + ZEXT116(1) * auVar114;
                    auVar125._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar138;
                    auVar199 = vpshuflw_avx2(auVar125,0);
                    auVar181 = vpshufd_avx2(auVar199,0);
                    auVar199 = vpshuflw_avx2(auVar125,0x55);
                    auVar131 = vpshufd_avx2(auVar199,0);
                    auVar199 = vpshuflw_avx2(auVar125,0xaa);
                    auVar101 = vpshufd_avx2(auVar199,0);
                    auVar199 = vpshuflw_avx2(auVar125,0xff);
                    auVar180 = vpshufd_avx2(auVar199,0);
                    auVar199 = vpshufb_avx2(auVar103,auVar236);
                    auVar181 = vpmaddubsw_avx2(auVar199,auVar181);
                    auVar199 = vpshufb_avx2(auVar103,auVar182);
                    auVar199 = vpmaddubsw_avx2(auVar199,auVar131);
                    auVar131 = vpshufb_avx2(auVar103,auVar249);
                    auVar131 = vpmaddubsw_avx2(auVar131,auVar101);
                    auVar199 = vpaddw_avx2(auVar199,auVar131);
                    auVar131 = vpshufb_avx2(auVar103,auVar255);
                    auVar131 = vpmaddubsw_avx2(auVar131,auVar180);
                    auVar181 = vpaddw_avx2(auVar121,auVar181);
                    auVar199 = vpaddw_avx2(auVar181,auVar199);
                    auVar199 = vpaddw_avx2(auVar199,auVar131);
                    auVar199 = vpsrlw_avx2(auVar199,auVar96);
                    *pauVar49 = auVar199;
                    lVar86 = lVar86 + 1;
                    uVar41 = uVar41 + 2;
                    pauVar49 = pauVar49 + 1;
                    iVar47 = iVar47 + iVar15;
                    iVar61 = iVar61 + iVar15;
                  } while (uVar53 != uVar41);
                  iVar47 = (int)uVar41 + -5;
                }
                iVar92 = iVar47 + iVar92;
                iVar61 = iVar2;
                if (iVar92 < iVar2) {
                  iVar61 = iVar92;
                }
                if (iVar92 < 0) {
                  iVar61 = 0;
                }
                auVar94 = *(undefined1 (*) [16])
                           (ref + ((ulong)(uVar69 & 0x7fffffff) - 7) + (long)(iVar61 * stride));
                auVar104._0_16_ = ZEXT116(0) * auVar94 + ZEXT116(1) * auVar94;
                auVar104._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar94;
                iVar92 = (iVar47 + 4) * iVar87 + uVar55;
                auVar139._8_8_ = 0;
                auVar139._0_8_ = av1_filter_8bit[iVar92 + iVar87 >> 10];
                auVar115._8_8_ = 0;
                auVar115._0_8_ = av1_filter_8bit[iVar92 >> 10];
                auVar126._0_16_ = ZEXT116(0) * auVar139 + ZEXT116(1) * auVar115;
                auVar126._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar139;
                auVar199 = vpshuflw_avx2(auVar126,0);
                auVar181 = vpshufd_avx2(auVar199,0);
                auVar199 = vpshuflw_avx2(auVar126,0x55);
                auVar131 = vpshufd_avx2(auVar199,0);
                auVar199 = vpshuflw_avx2(auVar126,0xaa);
                auVar101 = vpshufd_avx2(auVar199,0);
                auVar199 = vpshuflw_avx2(auVar126,0xff);
                auVar180 = vpshufd_avx2(auVar199,0);
                auVar199 = vpshufb_avx2(auVar104,auVar236);
                auVar181 = vpmaddubsw_avx2(auVar199,auVar181);
                auVar199 = vpshufb_avx2(auVar104,auVar182);
                auVar199 = vpmaddubsw_avx2(auVar199,auVar131);
                auVar236 = vpshufb_avx2(auVar104,auVar249);
                auVar236 = vpmaddubsw_avx2(auVar236,auVar101);
                auVar199 = vpaddw_avx2(auVar199,auVar236);
                auVar236 = vpshufb_avx2(auVar104,auVar255);
                auVar236 = vpmaddubsw_avx2(auVar236,auVar180);
                auVar181 = vpaddw_avx2(auVar121,auVar181);
                auVar199 = vpaddw_avx2(auVar181,auVar199);
                auVar199 = vpaddw_avx2(auVar199,auVar236);
                auVar199 = vpsrlw_avx2(auVar199,auVar96);
                *(undefined1 (*) [32])(local_180 + lVar86 * 0x20) = auVar199;
              }
              else {
                if (alpha != 0 && beta == 0) {
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = av1_filter_8bit[(int)uVar55 >> 10];
                  auVar137._8_8_ = 0;
                  auVar137._0_8_ = av1_filter_8bit[(int)(iVar14 + uVar55) >> 10];
                  auVar94 = vpunpcklwd_avx(auVar95,auVar137);
                  auVar113._8_8_ = 0;
                  auVar113._0_8_ = av1_filter_8bit[(int)(iVar77 + uVar55) >> 10];
                  auVar159._8_8_ = 0;
                  auVar159._0_8_ = av1_filter_8bit[(int)(iVar9 + uVar55) >> 10];
                  auVar114 = vpunpcklwd_avx(auVar113,auVar159);
                  auVar172._8_8_ = 0;
                  auVar172._0_8_ = av1_filter_8bit[(int)(iVar43 + uVar55) >> 10];
                  auVar204._8_8_ = 0;
                  auVar204._0_8_ = av1_filter_8bit[(int)(iVar7 + uVar55) >> 10];
                  auVar138 = vpunpcklwd_avx(auVar172,auVar204);
                  auVar193._8_8_ = 0;
                  auVar193._0_8_ = av1_filter_8bit[(int)(iVar8 + uVar55) >> 10];
                  auVar213._8_8_ = 0;
                  auVar213._0_8_ = av1_filter_8bit[(int)(uVar55 + iVar6) >> 10];
                  auVar115 = vpunpcklwd_avx(auVar193,auVar213);
                  auVar102._0_16_ = ZEXT116(0) * auVar94 + ZEXT116(1) * auVar94;
                  auVar102._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar94;
                  auVar146._0_16_ = ZEXT116(0) * auVar138 + ZEXT116(1) * auVar138;
                  auVar146._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar138;
                  auVar131 = vpunpckldq_avx2(auVar102,auVar146);
                  auVar199 = vpunpckhdq_avx2(auVar102,auVar146);
                  auVar124._0_16_ = ZEXT116(0) * auVar114 + ZEXT116(1) * auVar114;
                  auVar124._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar114;
                  auVar147._0_16_ = ZEXT116(0) * auVar115 + ZEXT116(1) * auVar115;
                  auVar147._16_16_ = ZEXT116(1) * auVar115;
                  auVar101 = vpunpckldq_avx2(auVar124,auVar147);
                  auVar181 = vpunpckhdq_avx2(auVar124,auVar147);
                  auVar180 = vpunpcklqdq_avx2(auVar131,auVar101);
                  auVar131 = vpunpckhqdq_avx2(auVar131,auVar101);
                  auVar101 = vpunpcklqdq_avx2(auVar199,auVar181);
                  auVar199 = vpunpckhqdq_avx2(auVar199,auVar181);
                  if (lVar39 < -5) {
                    iVar47 = -7;
                    lVar73 = 0;
                  }
                  else {
                    lVar86 = (ulong)(uVar69 & 0x7fffffff) - 7;
                    uVar41 = 0xfffffffffffffffe;
                    pauVar49 = &local_180;
                    lVar73 = 0;
                    do {
                      iVar61 = iVar92 + (int)uVar41 + -5;
                      iVar47 = iVar2;
                      if (iVar61 < iVar2) {
                        iVar47 = iVar61;
                      }
                      if (iVar61 < 0) {
                        iVar47 = 0;
                      }
                      iVar64 = iVar92 + (int)uVar41 + -4;
                      if (iVar2 <= iVar64) {
                        iVar64 = iVar2;
                      }
                      if (iVar61 < -1) {
                        iVar64 = 0;
                      }
                      auVar184._0_16_ =
                           ZEXT116(0) * *(undefined1 (*) [16])(ref + iVar64 * stride + lVar86) +
                           ZEXT116(1) * *(undefined1 (*) [16])(ref + iVar47 * stride + lVar86);
                      auVar184._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                           ZEXT116(1) * *(undefined1 (*) [16])(ref + iVar64 * stride + lVar86);
                      auVar181 = vpshufb_avx2(auVar184,auVar236);
                      auVar103 = vpshufb_avx2(auVar184,auVar182);
                      auVar125 = vpshufb_avx2(auVar184,auVar249);
                      auVar104 = vpshufb_avx2(auVar184,auVar255);
                      auVar179 = vpmaddubsw_avx2(auVar181,auVar180);
                      auVar181 = vpmaddubsw_avx2(auVar103,auVar131);
                      auVar103 = vpmaddubsw_avx2(auVar125,auVar101);
                      auVar181 = vpaddw_avx2(auVar181,auVar103);
                      auVar103 = vpmaddubsw_avx2(auVar104,auVar199);
                      auVar179 = vpaddw_avx2(auVar121,auVar179);
                      auVar181 = vpaddw_avx2(auVar179,auVar181);
                      auVar181 = vpaddw_avx2(auVar181,auVar103);
                      auVar181 = vpsrlw_avx2(auVar181,auVar96);
                      *pauVar49 = auVar181;
                      lVar73 = lVar73 + 1;
                      uVar41 = uVar41 + 2;
                      pauVar49 = pauVar49 + 1;
                    } while (uVar53 != uVar41);
                    iVar47 = (int)uVar41 + -5;
                  }
                  iVar47 = iVar47 + iVar92;
                  iVar92 = iVar2;
                  if (iVar47 < iVar2) {
                    iVar92 = iVar47;
                  }
                  if (iVar47 < 0) {
                    iVar92 = 0;
                  }
                  auVar185._0_16_ =
                       ZEXT116(0) * auVar199._0_16_ +
                       ZEXT116(1) *
                       *(undefined1 (*) [16])
                        (ref + ((ulong)(uVar69 & 0x7fffffff) - 7) + (long)(iVar92 * stride));
                  auVar185._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar199._0_16_;
                  auVar181 = vpshufb_avx2(auVar185,auVar236);
                  auVar182 = vpshufb_avx2(auVar185,auVar182);
                  auVar249 = vpshufb_avx2(auVar185,auVar249);
                  auVar255 = vpshufb_avx2(auVar185,auVar255);
                  auVar236 = vpmaddubsw_avx2(auVar181,auVar180);
                  auVar181 = vpmaddubsw_avx2(auVar182,auVar131);
                  auVar182 = vpmaddubsw_avx2(auVar249,auVar101);
                  auVar181 = vpaddw_avx2(auVar181,auVar182);
                  auVar182 = vpmaddubsw_avx2(auVar255,auVar199);
                  auVar199 = vpaddw_avx2(auVar121,auVar236);
                  auVar199 = vpaddw_avx2(auVar199,auVar181);
                  auVar199 = vpaddw_avx2(auVar199,auVar182);
                  goto LAB_00461b53;
                }
                if (lVar39 < -5) {
                  iVar47 = -7;
                  lVar73 = 0;
                }
                else {
                  lVar86 = (ulong)(uVar69 & 0x7fffffff) - 7;
                  uVar41 = 0xfffffffffffffffe;
                  local_4d0._4_4_ = 0;
                  local_4d0._0_4_ = uVar30;
                  local_2c0._4_4_ = 0;
                  local_2c0._0_4_ = uVar78;
                  local_2c0._8_24_ = auVar181._8_24_;
                  local_2e0._4_4_ = 0;
                  local_2e0._0_4_ = uVar58;
                  local_2e0._8_24_ = auVar199._8_24_;
                  pauVar49 = &local_180;
                  lVar73 = 0;
                  iVar47 = iVar32;
                  iVar61 = iVar33;
                  iVar64 = iVar29;
                  iVar59 = iVar28;
                  iVar62 = iVar27;
                  iVar81 = iVar26;
                  iVar88 = iVar60;
                  iVar51 = iVar63;
                  iVar71 = iVar68;
                  iVar80 = iVar3;
                  iVar65 = iVar44;
                  iVar52 = iVar31;
                  iVar75 = iVar45;
                  do {
                    auVar121 = local_80;
                    auVar181 = local_2c0._0_32_;
                    auVar199 = local_2e0;
                    auVar96 = local_4d0;
                    iVar70 = iVar92 + (int)uVar41 + -5;
                    iVar36 = iVar2;
                    if (iVar70 < iVar2) {
                      iVar36 = iVar70;
                    }
                    if (iVar70 < 0) {
                      iVar36 = 0;
                    }
                    iVar35 = iVar92 + (int)uVar41 + -4;
                    if (iVar2 <= iVar35) {
                      iVar35 = iVar2;
                    }
                    if (iVar70 < -1) {
                      iVar35 = 0;
                    }
                    auVar109._0_16_ =
                         ZEXT116(0) * *(undefined1 (*) [16])(ref + iVar35 * stride + lVar86) +
                         ZEXT116(1) * *(undefined1 (*) [16])(ref + iVar36 * stride + lVar86);
                    auVar109._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                         ZEXT116(1) * *(undefined1 (*) [16])(ref + iVar35 * stride + lVar86);
                    iVar36 = local_2c0._0_4_;
                    iVar70 = local_2e0._0_4_;
                    iVar35 = local_4d0._0_4_;
                    auVar117._8_8_ = 0;
                    auVar117._0_8_ = av1_filter_8bit[iVar75 + uVar85 >> 10];
                    auVar142._8_8_ = 0;
                    auVar142._0_8_ = av1_filter_8bit[iVar61 + uVar85 >> 10];
                    auVar131._0_16_ = ZEXT116(0) * auVar117 + ZEXT116(1) * auVar142;
                    auVar131._16_16_ = ZEXT116(1) * auVar117;
                    auVar161._8_8_ = 0;
                    auVar161._0_8_ = av1_filter_8bit[iVar36 + uVar85 >> 10];
                    auVar173._8_8_ = 0;
                    auVar173._0_8_ = av1_filter_8bit[iVar47 + uVar85 >> 10];
                    auVar168._0_16_ = ZEXT116(0) * auVar161 + ZEXT116(1) * auVar173;
                    auVar168._16_16_ = ZEXT116(1) * auVar161;
                    auVar195._8_8_ = 0;
                    auVar195._0_8_ = av1_filter_8bit[iVar70 + uVar85 >> 10];
                    auVar206._8_8_ = 0;
                    auVar206._0_8_ = av1_filter_8bit[iVar52 + uVar85 >> 10];
                    auVar186._0_16_ = ZEXT116(0) * auVar195 + ZEXT116(1) * auVar206;
                    auVar186._16_16_ = ZEXT116(1) * auVar195;
                    auVar131 = vpunpcklwd_avx2(auVar131,auVar186);
                    auVar216._8_8_ = 0;
                    auVar216._0_8_ = av1_filter_8bit[iVar65 + uVar85 >> 10];
                    auVar222._8_8_ = 0;
                    auVar222._0_8_ = av1_filter_8bit[iVar35 + uVar85 >> 10];
                    auVar187._0_16_ = ZEXT116(0) * auVar216 + ZEXT116(1) * auVar222;
                    auVar187._16_16_ = ZEXT116(1) * auVar216;
                    auVar101 = vpunpcklwd_avx2(auVar168,auVar187);
                    auVar227._8_8_ = 0;
                    auVar227._0_8_ = av1_filter_8bit[iVar88 + uVar85 >> 10];
                    auVar230._8_8_ = 0;
                    auVar230._0_8_ = av1_filter_8bit[iVar64 + uVar85 >> 10];
                    auVar188._0_16_ = ZEXT116(0) * auVar227 + ZEXT116(1) * auVar230;
                    auVar188._16_16_ = ZEXT116(1) * auVar227;
                    auVar235._8_8_ = 0;
                    auVar235._0_8_ = av1_filter_8bit[iVar51 + uVar85 >> 10];
                    auVar242._8_8_ = 0;
                    auVar242._0_8_ = av1_filter_8bit[iVar59 + uVar85 >> 10];
                    auVar201._0_16_ = ZEXT116(0) * auVar235 + ZEXT116(1) * auVar242;
                    auVar201._16_16_ = ZEXT116(1) * auVar235;
                    auVar182._16_16_ = _DAT_00564440;
                    auVar182._0_16_ = _DAT_00564440;
                    auVar236._16_16_ = _DAT_00563ce0;
                    auVar236._0_16_ = _DAT_00563ce0;
                    auVar248._8_8_ = 0;
                    auVar248._0_8_ = av1_filter_8bit[iVar71 + uVar85 >> 10];
                    auVar254._8_8_ = 0;
                    auVar254._0_8_ = av1_filter_8bit[iVar62 + uVar85 >> 10];
                    auVar211._0_16_ = ZEXT116(0) * auVar248 + ZEXT116(1) * auVar254;
                    auVar211._16_16_ = ZEXT116(1) * auVar248;
                    auVar255._16_16_ = _DAT_00564460;
                    auVar255._0_16_ = _DAT_00564460;
                    auVar249._16_16_ = _DAT_00564450;
                    auVar249._0_16_ = _DAT_00564450;
                    auVar180 = vpunpcklwd_avx2(auVar188,auVar211);
                    auVar258._8_8_ = 0;
                    auVar258._0_8_ = av1_filter_8bit[iVar80 + uVar85 >> 10];
                    auVar143._8_8_ = 0;
                    auVar143._0_8_ = av1_filter_8bit[iVar81 + uVar85 >> 10];
                    auVar153._0_16_ = ZEXT116(0) * auVar258 + ZEXT116(1) * auVar143;
                    auVar153._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar258;
                    auVar179 = vpunpcklwd_avx2(auVar201,auVar153);
                    auVar103 = vpunpckldq_avx2(auVar131,auVar180);
                    auVar131 = vpunpckhdq_avx2(auVar131,auVar180);
                    auVar180 = vpunpckldq_avx2(auVar101,auVar179);
                    auVar101 = vpunpckhdq_avx2(auVar101,auVar179);
                    auVar125 = vpunpcklqdq_avx2(auVar103,auVar180);
                    auVar180 = vpunpckhqdq_avx2(auVar103,auVar180);
                    auVar103 = vpunpcklqdq_avx2(auVar131,auVar101);
                    auVar179 = vpunpckhqdq_avx2(auVar131,auVar101);
                    auVar131 = vpshufb_avx2(auVar109,auVar236);
                    auVar101 = vpmaddubsw_avx2(auVar131,auVar125);
                    auVar131 = vpshufb_avx2(auVar109,auVar182);
                    auVar131 = vpmaddubsw_avx2(auVar131,auVar180);
                    auVar180 = vpshufb_avx2(auVar109,auVar249);
                    auVar180 = vpmaddubsw_avx2(auVar180,auVar103);
                    auVar131 = vpaddw_avx2(auVar131,auVar180);
                    auVar180 = vpshufb_avx2(auVar109,auVar255);
                    auVar180 = vpmaddubsw_avx2(auVar180,auVar179);
                    auVar101 = vpaddw_avx2(local_80,auVar101);
                    auVar131 = vpaddw_avx2(auVar101,auVar131);
                    auVar131 = vpaddw_avx2(auVar131,auVar180);
                    auVar131 = vpsrlw_avx2(auVar131,auVar225);
                    *pauVar49 = auVar131;
                    lVar73 = lVar73 + 1;
                    uVar41 = uVar41 + 2;
                    pauVar49 = pauVar49 + 1;
                    iVar80 = iVar80 + iVar15;
                    iVar71 = iVar71 + iVar15;
                    iVar51 = iVar51 + iVar15;
                    iVar88 = iVar88 + iVar15;
                    iVar65 = iVar65 + iVar15;
                    local_2e0._4_4_ = 0;
                    local_2e0._0_4_ = iVar70 + iVar15;
                    local_2e0._8_24_ = auVar199._8_24_;
                    local_2c0._4_4_ = 0;
                    local_2c0._0_4_ = iVar36 + iVar15;
                    local_2c0._8_24_ = auVar181._8_24_;
                    iVar75 = iVar75 + iVar15;
                    iVar81 = iVar81 + iVar15;
                    iVar62 = iVar62 + iVar15;
                    iVar59 = iVar59 + iVar15;
                    iVar64 = iVar64 + iVar15;
                    local_4d0._4_4_ = 0;
                    local_4d0._0_4_ = iVar35 + iVar15;
                    local_4d0._8_8_ = auVar96._8_8_;
                    iVar52 = iVar52 + iVar15;
                    iVar47 = iVar47 + iVar15;
                    iVar61 = iVar61 + iVar15;
                  } while (uVar53 != uVar41);
                  iVar47 = (int)uVar41 + -5;
                  auVar96 = auVar225;
                }
                iVar92 = iVar47 + iVar92;
                iVar61 = iVar2;
                if (iVar92 < iVar2) {
                  iVar61 = iVar92;
                }
                if (iVar92 < 0) {
                  iVar61 = 0;
                }
                auVar94 = *(undefined1 (*) [16])
                           (ref + ((ulong)(uVar69 & 0x7fffffff) - 7) + (long)(iVar61 * stride));
                iVar92 = (iVar47 + 4) * iVar87 + uVar55;
                auVar118._8_8_ = 0;
                auVar118._0_8_ = av1_filter_8bit[iVar92 >> 10];
                auVar162._8_8_ = 0;
                auVar162._0_8_ = av1_filter_8bit[iVar14 + iVar92 >> 10];
                auVar114 = vpunpcklwd_avx(auVar118,auVar162);
                auVar144._8_8_ = 0;
                auVar144._0_8_ = av1_filter_8bit[iVar77 + iVar92 >> 10];
                auVar174._8_8_ = 0;
                auVar174._0_8_ = av1_filter_8bit[iVar9 + iVar92 >> 10];
                auVar138 = vpunpcklwd_avx(auVar144,auVar174);
                auVar196._8_8_ = 0;
                auVar196._0_8_ = av1_filter_8bit[iVar43 + iVar92 >> 10];
                auVar217._8_8_ = 0;
                auVar217._0_8_ = av1_filter_8bit[iVar7 + iVar92 >> 10];
                auVar115 = vpunpcklwd_avx(auVar196,auVar217);
                auVar110._0_16_ = ZEXT116(0) * auVar94 + ZEXT116(1) * auVar94;
                auVar110._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar94;
                auVar207._8_8_ = 0;
                auVar207._0_8_ = av1_filter_8bit[iVar8 + iVar92 >> 10];
                auVar223._8_8_ = 0;
                auVar223._0_8_ = av1_filter_8bit[iVar92 + iVar6 >> 10];
                auVar139 = vpunpcklwd_avx(auVar207,auVar223);
                auVar117 = vpunpckldq_avx(auVar114,auVar115);
                auVar94 = vpunpckhdq_avx(auVar114,auVar115);
                auVar115 = vpunpckldq_avx(auVar138,auVar139);
                auVar114 = vpunpckhdq_avx(auVar138,auVar139);
                auVar138 = vpunpcklqdq_avx(auVar117,auVar115);
                auVar189._0_16_ = ZEXT116(0) * auVar110._0_16_ + ZEXT116(1) * auVar138;
                auVar189._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110._0_16_;
                auVar138 = vpunpckhqdq_avx(auVar117,auVar115);
                auVar169._0_16_ = ZEXT116(0) * auVar110._0_16_ + ZEXT116(1) * auVar138;
                auVar169._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110._0_16_;
                auVar138 = vpunpcklqdq_avx(auVar94,auVar114);
                auVar202._0_16_ = ZEXT116(0) * auVar110._0_16_ + ZEXT116(1) * auVar138;
                auVar202._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110._0_16_;
                auVar94 = vpunpckhqdq_avx(auVar94,auVar114);
                auVar132._0_16_ = ZEXT116(0) * auVar110._0_16_ + ZEXT116(1) * auVar94;
                auVar132._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110._0_16_;
                auVar199 = vpshufb_avx2(auVar110,auVar236);
                auVar181 = vpmaddubsw_avx2(auVar199,auVar189);
                auVar199 = vpshufb_avx2(auVar110,auVar182);
                auVar199 = vpmaddubsw_avx2(auVar199,auVar169);
                auVar236 = vpshufb_avx2(auVar110,auVar249);
                auVar236 = vpmaddubsw_avx2(auVar236,auVar202);
                auVar199 = vpaddw_avx2(auVar199,auVar236);
                auVar236 = vpshufb_avx2(auVar110,auVar255);
                auVar236 = vpmaddubsw_avx2(auVar236,auVar132);
                auVar181 = vpaddw_avx2(auVar121,auVar181);
                auVar199 = vpaddw_avx2(auVar181,auVar199);
                auVar199 = vpaddw_avx2(auVar199,auVar236);
                auVar199 = vpsrlw_avx2(auVar199,auVar96);
                *(undefined1 (*) [32])(local_180 + lVar73 * 0x20) = auVar199;
              }
            }
          }
          else {
            if (lVar1 < (long)uVar82) {
              iVar47 = -7;
              lVar86 = 0;
            }
            else {
              uVar41 = 0xfffffffffffffffe;
              pauVar49 = &local_180;
              lVar86 = 0;
              do {
                iVar61 = iVar92 + (int)uVar41 + -5;
                iVar47 = iVar2;
                if (iVar61 < iVar2) {
                  iVar47 = iVar61;
                }
                if (iVar61 < 0) {
                  iVar47 = 0;
                }
                iVar64 = iVar92 + (int)uVar41 + -4;
                if (iVar2 <= iVar64) {
                  iVar64 = iVar2;
                }
                if (iVar61 < -1) {
                  iVar64 = 0;
                }
                uVar93 = (undefined2)((uint)ref[iVar47 * stride + iVar34] * iVar50 + iVar90);
                auVar121._0_2_ = (undefined2)((uint)ref[iVar64 * stride + iVar34] * iVar50 + iVar90)
                ;
                auVar121._2_2_ = auVar121._0_2_;
                auVar121._4_2_ = auVar121._0_2_;
                auVar121._6_2_ = auVar121._0_2_;
                auVar121._8_2_ = auVar121._0_2_;
                auVar121._10_2_ = auVar121._0_2_;
                auVar121._12_2_ = auVar121._0_2_;
                auVar121._14_2_ = auVar121._0_2_;
                auVar121._16_2_ = auVar121._0_2_;
                auVar121._18_2_ = auVar121._0_2_;
                auVar121._20_2_ = auVar121._0_2_;
                auVar121._22_2_ = auVar121._0_2_;
                auVar121._24_2_ = auVar121._0_2_;
                auVar121._26_2_ = auVar121._0_2_;
                auVar121._28_2_ = auVar121._0_2_;
                auVar121._30_2_ = auVar121._0_2_;
                auVar199 = vpblendd_avx2(ZEXT1632(CONCAT214(uVar93,CONCAT212(uVar93,CONCAT210(uVar93
                                                  ,CONCAT28(uVar93,CONCAT26(uVar93,CONCAT24(uVar93,
                                                  CONCAT22(uVar93,uVar93)))))))),auVar121,0xf0);
                *pauVar49 = auVar199;
                lVar86 = lVar86 + 1;
                pauVar49 = pauVar49 + 1;
                uVar41 = uVar41 + 2;
              } while (uVar53 != uVar41);
              iVar47 = (int)uVar41 + -5;
            }
            iVar47 = iVar47 + iVar92;
            iVar92 = iVar2;
            if (iVar47 < iVar2) {
              iVar92 = iVar47;
            }
            if (iVar47 < 0) {
              iVar92 = 0;
            }
            uVar93 = (undefined2)(((uint)ref[iVar92 * stride + iVar34] << (bVar42 & 0x1f)) + iVar57)
            ;
            lVar86 = lVar86 * 0x20;
            *(undefined2 *)(local_180 + lVar86) = uVar93;
            *(undefined2 *)(local_180 + lVar86 + 2) = uVar93;
            *(undefined2 *)(local_180 + lVar86 + 4) = uVar93;
            *(undefined2 *)(local_180 + lVar86 + 6) = uVar93;
            *(undefined2 *)(local_180 + lVar86 + 8) = uVar93;
            *(undefined2 *)(local_180 + lVar86 + 10) = uVar93;
            *(undefined2 *)(local_180 + lVar86 + 0xc) = uVar93;
            *(undefined2 *)(local_180 + lVar86 + 0xe) = uVar93;
            *(undefined2 *)(local_180 + lVar86 + 0x10) = uVar93;
            *(undefined2 *)(local_160 + lVar86 + -0xe) = uVar93;
            *(undefined2 *)(local_160 + lVar86 + -0xc) = uVar93;
            *(undefined2 *)(local_160 + lVar86 + -10) = uVar93;
            *(undefined2 *)(local_160 + lVar86 + -8) = uVar93;
            *(undefined2 *)(local_160 + lVar86 + -6) = uVar93;
            *(undefined2 *)(local_160 + lVar86 + -4) = uVar93;
            *(undefined2 *)(local_160 + lVar86 + -2) = uVar93;
          }
          iVar92 = (((uint)lVar40 & 0xfffc) + (iVar84 + iVar54) * -4 & 0xffffffc0) + 0x10200;
          auVar96 = ZEXT416(uVar56);
          auVar94 = ZEXT416(uVar83);
          if (gamma == 0 && delta == 0) {
            if (0 < lVar39) {
              aWVar4 = av1_warped_filter[iVar92 >> 10];
              auVar105._16_2_ = aWVar4[0];
              auVar105._18_2_ = aWVar4[1];
              auVar105._20_2_ = aWVar4[2];
              auVar105._22_2_ = aWVar4[3];
              auVar105._24_2_ = aWVar4[4];
              auVar105._26_2_ = aWVar4[5];
              auVar105._28_2_ = aWVar4[6];
              auVar105._30_2_ = aWVar4[7];
              auVar105._0_2_ = aWVar4[0];
              auVar105._2_2_ = aWVar4[1];
              auVar105._4_2_ = aWVar4[2];
              auVar105._6_2_ = aWVar4[3];
              auVar105._8_2_ = aWVar4[4];
              auVar105._10_2_ = aWVar4[5];
              auVar105._12_2_ = aWVar4[6];
              auVar105._14_2_ = aWVar4[7];
              auVar199 = vpshufd_avx2(auVar105,0);
              auVar181 = vpshufd_avx2(auVar105,0x55);
              auVar121 = vpshufd_avx2(auVar105,0xaa);
              auVar236 = vpshufd_avx2(auVar105,0xff);
              auVar131 = vperm2i128_avx2(local_140,local_120,0x21);
              auVar255 = vpunpckhwd_avx2(local_140,auVar131);
              auVar101 = vperm2i128_avx2(local_160,local_140,0x21);
              auVar182 = vpunpckhwd_avx2(local_160,auVar101);
              auVar179 = vperm2i128_avx2(local_180,local_160,0x21);
              auVar249 = vpunpckhwd_avx2(local_180,auVar179);
              auVar180 = vpunpcklwd_avx2(local_140,auVar131);
              auVar131 = vpunpcklwd_avx2(local_160,auVar101);
              auVar101 = vpunpcklwd_avx2(local_180,auVar179);
              uVar41 = 0xfffffffffffffffe;
              pauVar49 = (undefined1 (*) [32])local_100;
              lVar40 = 0;
              do {
                auVar104 = auVar182;
                auVar182 = pauVar49[-1];
                auVar125 = vperm2i128_avx2(auVar182,*pauVar49,0x21);
                auVar103 = vpunpcklwd_avx2(auVar182,auVar125);
                auVar101 = vpmaddwd_avx2(auVar101,auVar199);
                auVar179 = vpmaddwd_avx2(auVar131,auVar181);
                auVar101 = vpaddd_avx2(auVar179,auVar101);
                auVar179 = vpmaddwd_avx2(auVar180,auVar121);
                auVar101 = vpaddd_avx2(auVar101,auVar179);
                auVar179 = vpmaddwd_avx2(auVar236,auVar103);
                auVar101 = vpaddd_avx2(auVar101,auVar179);
                auVar179 = vpunpckhwd_avx2(auVar182,auVar125);
                auVar182 = vpmaddwd_avx2(auVar249,auVar199);
                auVar249 = vpmaddwd_avx2(auVar104,auVar181);
                auVar182 = vpaddd_avx2(auVar249,auVar182);
                auVar249 = vpmaddwd_avx2(auVar255,auVar121);
                auVar182 = vpaddd_avx2(auVar249,auVar182);
                auVar249 = vpmaddwd_avx2(auVar236,auVar179);
                auVar182 = vpaddd_avx2(auVar249,auVar182);
                auVar125 = vpunpckldq_avx2(auVar101,auVar182);
                auVar249 = vpunpckhdq_avx2(auVar101,auVar182);
                auVar17._4_4_ = iVar74;
                auVar17._0_4_ = iVar74;
                auVar17._8_4_ = iVar74;
                auVar17._12_4_ = iVar74;
                auVar17._16_4_ = iVar74;
                auVar17._20_4_ = iVar74;
                auVar17._24_4_ = iVar74;
                auVar17._28_4_ = iVar74;
                auVar182 = vpaddd_avx2(auVar125,auVar17);
                if (conv_params->is_compound == 0) {
                  auVar101 = vpsrad_avx2(auVar182,auVar94);
                  auVar182 = vpaddd_avx2(auVar249,auVar17);
                  auVar182 = vpsrad_avx2(auVar182,auVar94);
                  auVar182 = vpackssdw_avx2(auVar101,auVar182);
                  auVar182 = vpackuswb_avx2(auVar182,auVar104);
                  if (p_width == 4) {
                    *(int *)(puVar89 + lVar40 * 2) = auVar182._0_4_;
                    *(int *)(local_550 + lVar40 * 2) = auVar182._16_4_;
                  }
                  else {
                    *(long *)(puVar89 + lVar40 * 2) = auVar182._0_8_;
                    *(long *)(local_550 + lVar40 * 2) = auVar182._16_8_;
                  }
                }
                else {
                  iVar92 = (int)uVar41;
                  lVar86 = (long)((iVar79 + iVar92 + 2) * conv_params->dst_stride);
                  pCVar5 = conv_params->dst;
                  auVar182 = vpsrad_avx2(auVar182,auVar94);
                  lVar73 = (long)((iVar79 + iVar92 + 3) * conv_params->dst_stride);
                  auVar182 = vpackusdw_avx2(auVar182,auVar182);
                  if (conv_params->do_average == 0) {
                    *(long *)(pCVar5 + lVar48 + lVar86) = auVar182._0_8_;
                    *(long *)(pCVar5 + lVar48 + lVar73) = auVar182._16_8_;
                  }
                  else {
                    auVar253._8_8_ = 0;
                    auVar253._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar73);
                    auVar246._8_8_ = 0;
                    auVar246._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar86);
                    auVar250._0_16_ = ZEXT116(0) * auVar253 + ZEXT116(1) * auVar246;
                    auVar250._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar253;
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar182 = vpaddw_avx2(auVar250,auVar182);
                      auVar182 = vpsraw_avx2(auVar182,1);
                    }
                    else {
                      auVar182 = vpunpcklwd_avx2(auVar250,auVar182);
                      auVar182 = vpmaddwd_avx2(auVar182,auVar119);
                      auVar182 = vpsrad_avx2(auVar182,4);
                      auVar182 = vpackusdw_avx2(auVar182,auVar182);
                    }
                    auVar182 = vpaddw_avx2(auVar182,auVar97);
                    auVar182 = vpsraw_avx2(auVar182,auVar96);
                    auVar182 = vpackuswb_avx2(auVar182,auVar182);
                    *(int *)(puVar89 + lVar40 * 2) = auVar182._0_4_;
                    *(int *)(local_550 + lVar40 * 2) = auVar182._16_4_;
                  }
                  if (4 < p_width) {
                    lVar86 = (long)((iVar79 + iVar92 + 2) * conv_params->dst_stride);
                    lVar73 = (long)((iVar79 + iVar92 + 3) * conv_params->dst_stride);
                    auVar182 = vpaddd_avx2(auVar249,auVar17);
                    auVar182 = vpsrad_avx2(auVar182,auVar94);
                    auVar182 = vpackusdw_avx2(auVar182,auVar182);
                    pCVar5 = conv_params->dst;
                    if (conv_params->do_average == 0) {
                      *(long *)(pCVar5 + lVar48 + lVar86 + 4) = auVar182._0_8_;
                      *(long *)(pCVar5 + lVar48 + lVar73 + 4) = auVar182._16_8_;
                    }
                    else {
                      auVar247._8_8_ = 0;
                      auVar247._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar73 + 4);
                      auVar240._8_8_ = 0;
                      auVar240._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar86 + 4);
                      auVar243._0_16_ = ZEXT116(0) * auVar247 + ZEXT116(1) * auVar240;
                      auVar243._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar247;
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar182 = vpaddw_avx2(auVar243,auVar182);
                        auVar182 = vpsraw_avx2(auVar182,1);
                      }
                      else {
                        auVar182 = vpunpcklwd_avx2(auVar243,auVar182);
                        auVar182 = vpmaddwd_avx2(auVar182,auVar119);
                        auVar182 = vpsrad_avx2(auVar182,4);
                        auVar182 = vpackusdw_avx2(auVar182,auVar182);
                      }
                      auVar182 = vpaddw_avx2(auVar182,auVar97);
                      auVar182 = vpsraw_avx2(auVar182,auVar96);
                      auVar182 = vpackuswb_avx2(auVar182,auVar182);
                      *(int *)(puVar89 + lVar40 * 2 + 4) = auVar182._0_4_;
                      *(int *)(local_550 + lVar40 * 2 + 4) = auVar182._16_4_;
                    }
                  }
                }
                lVar40 = lVar40 + lVar67;
                uVar41 = uVar41 + 2;
                pauVar49 = pauVar49 + 1;
                auVar182 = auVar255;
                auVar249 = auVar104;
                auVar101 = auVar131;
                auVar131 = auVar180;
                auVar180 = auVar103;
                auVar255 = auVar179;
              } while (uVar76 != uVar41);
            }
          }
          else if (gamma != 0 || delta == 0) {
            if (gamma != 0 && delta == 0) {
              if (0 < lVar39) {
                aWVar4 = av1_warped_filter[iVar54 + iVar92 >> 10];
                auVar106._16_2_ = aWVar4[0];
                auVar106._18_2_ = aWVar4[1];
                auVar106._20_2_ = aWVar4[2];
                auVar106._22_2_ = aWVar4[3];
                auVar106._24_2_ = aWVar4[4];
                auVar106._26_2_ = aWVar4[5];
                auVar106._28_2_ = aWVar4[6];
                auVar106._30_2_ = aWVar4[7];
                auVar106._0_2_ = aWVar4[0];
                auVar106._2_2_ = aWVar4[1];
                auVar106._4_2_ = aWVar4[2];
                auVar106._6_2_ = aWVar4[3];
                auVar106._8_2_ = aWVar4[4];
                auVar106._10_2_ = aWVar4[5];
                auVar106._12_2_ = aWVar4[6];
                auVar106._14_2_ = aWVar4[7];
                aWVar4 = av1_warped_filter[iVar12 + iVar92 >> 10];
                auVar127._16_2_ = aWVar4[0];
                auVar127._18_2_ = aWVar4[1];
                auVar127._20_2_ = aWVar4[2];
                auVar127._22_2_ = aWVar4[3];
                auVar127._24_2_ = aWVar4[4];
                auVar127._26_2_ = aWVar4[5];
                auVar127._28_2_ = aWVar4[6];
                auVar127._30_2_ = aWVar4[7];
                auVar127._0_2_ = aWVar4[0];
                auVar127._2_2_ = aWVar4[1];
                auVar127._4_2_ = aWVar4[2];
                auVar127._6_2_ = aWVar4[3];
                auVar127._8_2_ = aWVar4[4];
                auVar127._10_2_ = aWVar4[5];
                auVar127._12_2_ = aWVar4[6];
                auVar127._14_2_ = aWVar4[7];
                aWVar4 = av1_warped_filter[iVar13 + iVar92 >> 10];
                auVar149._16_2_ = aWVar4[0];
                auVar149._18_2_ = aWVar4[1];
                auVar149._20_2_ = aWVar4[2];
                auVar149._22_2_ = aWVar4[3];
                auVar149._24_2_ = aWVar4[4];
                auVar149._26_2_ = aWVar4[5];
                auVar149._28_2_ = aWVar4[6];
                auVar149._30_2_ = aWVar4[7];
                auVar149._0_2_ = aWVar4[0];
                auVar149._2_2_ = aWVar4[1];
                auVar149._4_2_ = aWVar4[2];
                auVar149._6_2_ = aWVar4[3];
                auVar149._8_2_ = aWVar4[4];
                auVar149._10_2_ = aWVar4[5];
                auVar149._12_2_ = aWVar4[6];
                auVar149._14_2_ = aWVar4[7];
                aWVar4 = av1_warped_filter[iVar10 + iVar92 >> 10];
                auVar165._16_2_ = aWVar4[0];
                auVar165._18_2_ = aWVar4[1];
                auVar165._20_2_ = aWVar4[2];
                auVar165._22_2_ = aWVar4[3];
                auVar165._24_2_ = aWVar4[4];
                auVar165._26_2_ = aWVar4[5];
                auVar165._28_2_ = aWVar4[6];
                auVar165._30_2_ = aWVar4[7];
                auVar165._0_2_ = aWVar4[0];
                auVar165._2_2_ = aWVar4[1];
                auVar165._4_2_ = aWVar4[2];
                auVar165._6_2_ = aWVar4[3];
                auVar165._8_2_ = aWVar4[4];
                auVar165._10_2_ = aWVar4[5];
                auVar165._12_2_ = aWVar4[6];
                auVar165._14_2_ = aWVar4[7];
                auVar199 = vpunpckhdq_avx2(auVar106,auVar127);
                auVar181 = vpunpckhdq_avx2(auVar149,auVar165);
                auVar236 = vpunpckhqdq_avx2(auVar199,auVar181);
                local_2c0._0_32_ = vpunpcklqdq_avx2(auVar199,auVar181);
                auVar199 = vpunpckldq_avx2(auVar106,auVar127);
                auVar181 = vpunpckldq_avx2(auVar149,auVar165);
                local_2e0 = vpunpckhqdq_avx2(auVar199,auVar181);
                auVar180 = vpunpcklqdq_avx2(auVar199,auVar181);
                aWVar4 = av1_warped_filter[iVar92 >> 10];
                auVar107._16_2_ = aWVar4[0];
                auVar107._18_2_ = aWVar4[1];
                auVar107._20_2_ = aWVar4[2];
                auVar107._22_2_ = aWVar4[3];
                auVar107._24_2_ = aWVar4[4];
                auVar107._26_2_ = aWVar4[5];
                auVar107._28_2_ = aWVar4[6];
                auVar107._30_2_ = aWVar4[7];
                auVar107._0_2_ = aWVar4[0];
                auVar107._2_2_ = aWVar4[1];
                auVar107._4_2_ = aWVar4[2];
                auVar107._6_2_ = aWVar4[3];
                auVar107._8_2_ = aWVar4[4];
                auVar107._10_2_ = aWVar4[5];
                auVar107._12_2_ = aWVar4[6];
                auVar107._14_2_ = aWVar4[7];
                aWVar4 = av1_warped_filter[iVar54 * 2 + iVar92 >> 10];
                auVar128._16_2_ = aWVar4[0];
                auVar128._18_2_ = aWVar4[1];
                auVar128._20_2_ = aWVar4[2];
                auVar128._22_2_ = aWVar4[3];
                auVar128._24_2_ = aWVar4[4];
                auVar128._26_2_ = aWVar4[5];
                auVar128._28_2_ = aWVar4[6];
                auVar128._30_2_ = aWVar4[7];
                auVar128._0_2_ = aWVar4[0];
                auVar128._2_2_ = aWVar4[1];
                auVar128._4_2_ = aWVar4[2];
                auVar128._6_2_ = aWVar4[3];
                auVar128._8_2_ = aWVar4[4];
                auVar128._10_2_ = aWVar4[5];
                auVar128._12_2_ = aWVar4[6];
                auVar128._14_2_ = aWVar4[7];
                aWVar4 = av1_warped_filter[iVar54 * 4 + iVar92 >> 10];
                auVar150._16_2_ = aWVar4[0];
                auVar150._18_2_ = aWVar4[1];
                auVar150._20_2_ = aWVar4[2];
                auVar150._22_2_ = aWVar4[3];
                auVar150._24_2_ = aWVar4[4];
                auVar150._26_2_ = aWVar4[5];
                auVar150._28_2_ = aWVar4[6];
                auVar150._30_2_ = aWVar4[7];
                auVar150._0_2_ = aWVar4[0];
                auVar150._2_2_ = aWVar4[1];
                auVar150._4_2_ = aWVar4[2];
                auVar150._6_2_ = aWVar4[3];
                auVar150._8_2_ = aWVar4[4];
                auVar150._10_2_ = aWVar4[5];
                auVar150._12_2_ = aWVar4[6];
                auVar150._14_2_ = aWVar4[7];
                aWVar4 = av1_warped_filter[iVar92 + iVar11 >> 10];
                auVar166._16_2_ = aWVar4[0];
                auVar166._18_2_ = aWVar4[1];
                auVar166._20_2_ = aWVar4[2];
                auVar166._22_2_ = aWVar4[3];
                auVar166._24_2_ = aWVar4[4];
                auVar166._26_2_ = aWVar4[5];
                auVar166._28_2_ = aWVar4[6];
                auVar166._30_2_ = aWVar4[7];
                auVar166._0_2_ = aWVar4[0];
                auVar166._2_2_ = aWVar4[1];
                auVar166._4_2_ = aWVar4[2];
                auVar166._6_2_ = aWVar4[3];
                auVar166._8_2_ = aWVar4[4];
                auVar166._10_2_ = aWVar4[5];
                auVar166._12_2_ = aWVar4[6];
                auVar166._14_2_ = aWVar4[7];
                auVar199 = vpunpckhdq_avx2(auVar107,auVar128);
                auVar181 = vpunpckhdq_avx2(auVar150,auVar166);
                auVar182 = vpunpckhqdq_avx2(auVar199,auVar181);
                auVar179 = vpunpcklqdq_avx2(auVar199,auVar181);
                auVar199 = vpunpckldq_avx2(auVar107,auVar128);
                auVar181 = vpunpckldq_avx2(auVar150,auVar166);
                auVar249 = vpunpckhqdq_avx2(auVar199,auVar181);
                auVar103 = vpunpcklqdq_avx2(auVar199,auVar181);
                auVar181 = vperm2i128_avx2(local_140,local_120,0x21);
                auVar121 = vpunpckhwd_avx2(local_140,auVar181);
                auVar131 = vperm2i128_avx2(local_160,local_140,0x21);
                auVar199 = vpunpckhwd_avx2(local_160,auVar131);
                auVar255 = vpunpcklwd_avx2(local_140,auVar181);
                auVar101 = vperm2i128_avx2(local_180,local_160,0x21);
                auVar131 = vpunpcklwd_avx2(local_160,auVar131);
                auVar181 = vpunpckhwd_avx2(local_180,auVar101);
                auVar101 = vpunpcklwd_avx2(local_180,auVar101);
                uVar41 = 0xfffffffffffffffe;
                pauVar49 = (undefined1 (*) [32])local_100;
                lVar40 = 0;
                do {
                  auVar104 = auVar131;
                  auVar131 = auVar255;
                  auVar109 = auVar199;
                  auVar101 = vpmaddwd_avx2(auVar101,auVar103);
                  auVar199 = pauVar49[-1];
                  auVar126 = vperm2i128_avx2(auVar199,*pauVar49,0x21);
                  auVar255 = vpunpcklwd_avx2(auVar199,auVar126);
                  auVar125 = vpmaddwd_avx2(auVar104,auVar249);
                  auVar101 = vpaddd_avx2(auVar125,auVar101);
                  auVar125 = vpmaddwd_avx2(auVar179,auVar131);
                  auVar101 = vpaddd_avx2(auVar125,auVar101);
                  auVar125 = vpmaddwd_avx2(auVar255,auVar182);
                  auVar101 = vpaddd_avx2(auVar125,auVar101);
                  auVar181 = vpmaddwd_avx2(auVar181,auVar180);
                  auVar125 = vpunpckhwd_avx2(auVar199,auVar126);
                  auVar199 = vpmaddwd_avx2(auVar109,local_2e0);
                  auVar199 = vpaddd_avx2(auVar181,auVar199);
                  auVar181 = vpmaddwd_avx2(auVar121,local_2c0._0_32_);
                  auVar199 = vpaddd_avx2(auVar181,auVar199);
                  auVar181 = vpmaddwd_avx2(auVar125,auVar236);
                  auVar199 = vpaddd_avx2(auVar181,auVar199);
                  auVar126 = vpunpckldq_avx2(auVar101,auVar199);
                  auVar181 = vpunpckhdq_avx2(auVar101,auVar199);
                  auVar18._4_4_ = iVar74;
                  auVar18._0_4_ = iVar74;
                  auVar18._8_4_ = iVar74;
                  auVar18._12_4_ = iVar74;
                  auVar18._16_4_ = iVar74;
                  auVar18._20_4_ = iVar74;
                  auVar18._24_4_ = iVar74;
                  auVar18._28_4_ = iVar74;
                  auVar199 = vpaddd_avx2(auVar126,auVar18);
                  if (conv_params->is_compound == 0) {
                    auVar101 = vpsrad_avx2(auVar199,auVar94);
                    auVar199 = vpaddd_avx2(auVar18,auVar181);
                    auVar199 = vpsrad_avx2(auVar199,auVar94);
                    auVar199 = vpackssdw_avx2(auVar101,auVar199);
                    auVar199 = vpackuswb_avx2(auVar199,auVar121);
                    if (p_width == 4) {
                      *(int *)(puVar89 + lVar40 * 2) = auVar199._0_4_;
                      *(int *)(local_550 + lVar40 * 2) = auVar199._16_4_;
                    }
                    else {
                      *(long *)(puVar89 + lVar40 * 2) = auVar199._0_8_;
                      *(long *)(local_550 + lVar40 * 2) = auVar199._16_8_;
                    }
                  }
                  else {
                    iVar92 = (int)uVar41;
                    lVar86 = (long)((iVar79 + iVar92 + 2) * conv_params->dst_stride);
                    pCVar5 = conv_params->dst;
                    auVar199 = vpsrad_avx2(auVar199,auVar94);
                    lVar73 = (long)((iVar79 + iVar92 + 3) * conv_params->dst_stride);
                    auVar199 = vpackusdw_avx2(auVar199,auVar199);
                    if (conv_params->do_average == 0) {
                      *(long *)(pCVar5 + lVar48 + lVar86) = auVar199._0_8_;
                      *(long *)(pCVar5 + lVar48 + lVar73) = auVar199._16_8_;
                    }
                    else {
                      auVar241._8_8_ = 0;
                      auVar241._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar73);
                      auVar233._8_8_ = 0;
                      auVar233._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar86);
                      auVar237._0_16_ = ZEXT116(0) * auVar241 + ZEXT116(1) * auVar233;
                      auVar237._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar241;
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar199 = vpaddw_avx2(auVar237,auVar199);
                        auVar199 = vpsraw_avx2(auVar199,1);
                      }
                      else {
                        auVar199 = vpunpcklwd_avx2(auVar237,auVar199);
                        auVar199 = vpmaddwd_avx2(auVar199,auVar119);
                        auVar199 = vpsrad_avx2(auVar199,4);
                        auVar199 = vpackusdw_avx2(auVar199,auVar199);
                      }
                      auVar199 = vpaddw_avx2(auVar199,auVar97);
                      auVar199 = vpsraw_avx2(auVar199,auVar96);
                      auVar199 = vpackuswb_avx2(auVar199,auVar199);
                      *(int *)(puVar89 + lVar40 * 2) = auVar199._0_4_;
                      *(int *)(local_550 + lVar40 * 2) = auVar199._16_4_;
                    }
                    if (4 < p_width) {
                      lVar86 = (long)((iVar79 + iVar92 + 2) * conv_params->dst_stride);
                      lVar73 = (long)((iVar79 + iVar92 + 3) * conv_params->dst_stride);
                      auVar19._4_4_ = iVar74;
                      auVar19._0_4_ = iVar74;
                      auVar19._8_4_ = iVar74;
                      auVar19._12_4_ = iVar74;
                      auVar19._16_4_ = iVar74;
                      auVar19._20_4_ = iVar74;
                      auVar19._24_4_ = iVar74;
                      auVar19._28_4_ = iVar74;
                      auVar199 = vpaddd_avx2(auVar181,auVar19);
                      auVar199 = vpsrad_avx2(auVar199,auVar94);
                      auVar199 = vpackusdw_avx2(auVar199,auVar199);
                      pCVar5 = conv_params->dst;
                      if (conv_params->do_average == 0) {
                        *(long *)(pCVar5 + lVar48 + lVar86 + 4) = auVar199._0_8_;
                        *(long *)(pCVar5 + lVar48 + lVar73 + 4) = auVar199._16_8_;
                      }
                      else {
                        auVar234._8_8_ = 0;
                        auVar234._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar73 + 4);
                        auVar194._8_8_ = 0;
                        auVar194._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar86 + 4);
                        auVar200._0_16_ = ZEXT116(0) * auVar234 + ZEXT116(1) * auVar194;
                        auVar200._16_16_ =
                             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar234;
                        if (conv_params->use_dist_wtd_comp_avg == 0) {
                          auVar199 = vpaddw_avx2(auVar199,auVar200);
                          auVar199 = vpsraw_avx2(auVar199,1);
                        }
                        else {
                          auVar199 = vpunpcklwd_avx2(auVar200,auVar199);
                          auVar199 = vpmaddwd_avx2(auVar199,auVar119);
                          auVar199 = vpsrad_avx2(auVar199,4);
                          auVar199 = vpackusdw_avx2(auVar199,auVar199);
                        }
                        auVar199 = vpaddw_avx2(auVar199,auVar97);
                        auVar199 = vpsraw_avx2(auVar199,auVar96);
                        auVar199 = vpackuswb_avx2(auVar199,auVar199);
                        *(int *)(puVar89 + lVar40 * 2 + 4) = auVar199._0_4_;
                        *(int *)(local_550 + lVar40 * 2 + 4) = auVar199._16_4_;
                      }
                    }
                  }
                  lVar40 = lVar40 + lVar67;
                  uVar41 = uVar41 + 2;
                  pauVar49 = pauVar49 + 1;
                  auVar199 = auVar121;
                  auVar101 = auVar104;
                  auVar121 = auVar125;
                  auVar181 = auVar109;
                } while (uVar76 != uVar41);
              }
            }
            else if (0 < lVar39) {
              auVar236 = vperm2i128_avx2(local_140,local_120,0x21);
              auVar121 = vpunpckhwd_avx2(local_140,auVar236);
              auVar182 = vperm2i128_avx2(local_160,local_140,0x21);
              auVar199 = vpunpckhwd_avx2(local_160,auVar182);
              auVar249 = vperm2i128_avx2(local_180,local_160,0x21);
              auVar181 = vpunpckhwd_avx2(local_180,auVar249);
              auVar236 = vpunpcklwd_avx2(local_140,auVar236);
              auVar182 = vpunpcklwd_avx2(local_160,auVar182);
              auVar249 = vpunpcklwd_avx2(local_180,auVar249);
              uVar41 = 0xfffffffffffffffe;
              pauVar49 = (undefined1 (*) [32])local_100;
              lVar40 = 0;
              do {
                local_400 = auVar199;
                auVar126 = auVar236;
                auVar108._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar84 + iVar92 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar92 >> 10];
                auVar108._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar84 + iVar92 >> 10];
                auVar129._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar84 + iVar54 * 2 + iVar92 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar54 * 2 + iVar92 >> 10];
                auVar129._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar84 + iVar54 * 2 + iVar92 >> 10];
                auVar151._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar84 + iVar54 * 4 + iVar92 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar54 * 4 + iVar92 >> 10];
                auVar151._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar84 + iVar54 * 4 + iVar92 >> 10];
                auVar167._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar11 + iVar84 + iVar92 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar11 + iVar92 >> 10];
                auVar167._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar11 + iVar84 + iVar92 >> 10];
                auVar183._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar84 + iVar54 + iVar92 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar54 + iVar92 >> 10];
                auVar183._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar84 + iVar54 + iVar92 >> 10];
                auVar210._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar12 + iVar84 + iVar92 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar12 + iVar92 >> 10];
                auVar210._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar12 + iVar84 + iVar92 >> 10];
                auVar219._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar13 + iVar84 + iVar92 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar13 + iVar92 >> 10];
                auVar219._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar13 + iVar84 + iVar92 >> 10];
                auVar224._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar10 + iVar84 + iVar92 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar10 + iVar92 >> 10];
                auVar224._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar10 + iVar84 + iVar92 >> 10];
                auVar255 = vpunpckldq_avx2(auVar108,auVar129);
                auVar131 = vpunpckldq_avx2(auVar151,auVar167);
                auVar199 = vpunpckhdq_avx2(auVar108,auVar129);
                auVar236 = vpunpckhdq_avx2(auVar151,auVar167);
                auVar101 = vpunpcklqdq_avx2(auVar255,auVar131);
                auVar249 = vpmaddwd_avx2(auVar249,auVar101);
                auVar131 = vpunpckhqdq_avx2(auVar255,auVar131);
                auVar103 = vpunpcklqdq_avx2(auVar199,auVar236);
                auVar101 = vpunpckhqdq_avx2(auVar199,auVar236);
                auVar236 = vpunpckldq_avx2(auVar183,auVar210);
                auVar180 = vpunpckldq_avx2(auVar219,auVar224);
                auVar199 = vpunpcklqdq_avx2(auVar236,auVar180);
                auVar255 = vpmaddwd_avx2(auVar181,auVar199);
                auVar199 = vpunpckhdq_avx2(auVar183,auVar210);
                auVar181 = vpunpckhdq_avx2(auVar219,auVar224);
                auVar180 = vpunpckhqdq_avx2(auVar236,auVar180);
                auVar125 = vpunpcklqdq_avx2(auVar199,auVar181);
                auVar179 = vpunpckhqdq_avx2(auVar199,auVar181);
                auVar199 = pauVar49[-1];
                auVar104 = vperm2i128_avx2(auVar199,*pauVar49,0x21);
                auVar236 = vpunpcklwd_avx2(auVar199,auVar104);
                auVar181 = vpmaddwd_avx2(auVar182,auVar131);
                auVar181 = vpaddd_avx2(auVar181,auVar249);
                auVar249 = vpmaddwd_avx2(auVar126,auVar103);
                auVar131 = vpmaddwd_avx2(auVar236,auVar101);
                auVar249 = vpaddd_avx2(auVar249,auVar131);
                auVar181 = vpaddd_avx2(auVar181,auVar249);
                auVar131 = vpunpckhwd_avx2(auVar199,auVar104);
                auVar199 = vpmaddwd_avx2(local_400,auVar180);
                auVar199 = vpaddd_avx2(auVar199,auVar255);
                auVar249 = vpmaddwd_avx2(auVar121,auVar125);
                auVar255 = vpmaddwd_avx2(auVar131,auVar179);
                auVar249 = vpaddd_avx2(auVar249,auVar255);
                auVar199 = vpaddd_avx2(auVar199,auVar249);
                auVar249 = vpunpckldq_avx2(auVar181,auVar199);
                auVar199 = vpunpckhdq_avx2(auVar181,auVar199);
                if (conv_params->is_compound == 0) {
                  auVar21._4_4_ = iVar74;
                  auVar21._0_4_ = iVar74;
                  auVar21._8_4_ = iVar74;
                  auVar21._12_4_ = iVar74;
                  auVar21._16_4_ = iVar74;
                  auVar21._20_4_ = iVar74;
                  auVar21._24_4_ = iVar74;
                  auVar21._28_4_ = iVar74;
                  auVar181 = vpaddd_avx2(auVar249,auVar21);
                  auVar181 = vpsrad_avx2(auVar181,auVar94);
                  auVar199 = vpaddd_avx2(auVar199,auVar21);
                  auVar199 = vpsrad_avx2(auVar199,auVar94);
                  auVar199 = vpackssdw_avx2(auVar181,auVar199);
                  auVar199 = vpackuswb_avx2(auVar199,auVar199);
                  if (p_width == 4) {
                    *(int *)(puVar89 + lVar40 * 2) = auVar199._0_4_;
                    *(int *)(local_550 + lVar40 * 2) = auVar199._16_4_;
                  }
                  else {
                    *(long *)(puVar89 + lVar40 * 2) = auVar199._0_8_;
                    *(long *)(local_550 + lVar40 * 2) = auVar199._16_8_;
                  }
                }
                else {
                  iVar47 = (int)uVar41;
                  lVar86 = (long)((iVar79 + iVar47 + 2) * conv_params->dst_stride);
                  pCVar5 = conv_params->dst;
                  auVar20._4_4_ = iVar74;
                  auVar20._0_4_ = iVar74;
                  auVar20._8_4_ = iVar74;
                  auVar20._12_4_ = iVar74;
                  auVar20._16_4_ = iVar74;
                  auVar20._20_4_ = iVar74;
                  auVar20._24_4_ = iVar74;
                  auVar20._28_4_ = iVar74;
                  auVar181 = vpaddd_avx2(auVar249,auVar20);
                  auVar181 = vpsrad_avx2(auVar181,auVar94);
                  lVar73 = (long)((iVar79 + iVar47 + 3) * conv_params->dst_stride);
                  auVar181 = vpackusdw_avx2(auVar181,auVar181);
                  if (conv_params->do_average == 0) {
                    *(long *)(pCVar5 + lVar48 + lVar86) = auVar181._0_8_;
                    *(long *)(pCVar5 + lVar48 + lVar73) = auVar181._16_8_;
                  }
                  else {
                    auVar160._8_8_ = 0;
                    auVar160._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar73);
                    auVar140._8_8_ = 0;
                    auVar140._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar86);
                    auVar152._0_16_ = ZEXT116(0) * auVar160 + ZEXT116(1) * auVar140;
                    auVar152._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar160;
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar181 = vpaddw_avx2(auVar181,auVar152);
                      auVar181 = vpsraw_avx2(auVar181,1);
                    }
                    else {
                      auVar181 = vpunpcklwd_avx2(auVar152,auVar181);
                      auVar181 = vpmaddwd_avx2(auVar181,auVar119);
                      auVar181 = vpsrad_avx2(auVar181,4);
                      auVar181 = vpackusdw_avx2(auVar181,auVar181);
                    }
                    auVar181 = vpaddw_avx2(auVar181,auVar97);
                    auVar181 = vpsraw_avx2(auVar181,auVar96);
                    auVar181 = vpackuswb_avx2(auVar181,auVar181);
                    *(int *)(puVar89 + lVar40 * 2) = auVar181._0_4_;
                    *(int *)(local_550 + lVar40 * 2) = auVar181._16_4_;
                  }
                  if (4 < p_width) {
                    lVar86 = (long)((iVar79 + iVar47 + 2) * conv_params->dst_stride);
                    lVar73 = (long)((iVar79 + iVar47 + 3) * conv_params->dst_stride);
                    auVar22._4_4_ = iVar74;
                    auVar22._0_4_ = iVar74;
                    auVar22._8_4_ = iVar74;
                    auVar22._12_4_ = iVar74;
                    auVar22._16_4_ = iVar74;
                    auVar22._20_4_ = iVar74;
                    auVar22._24_4_ = iVar74;
                    auVar22._28_4_ = iVar74;
                    auVar199 = vpaddd_avx2(auVar199,auVar22);
                    auVar199 = vpsrad_avx2(auVar199,auVar94);
                    auVar199 = vpackusdw_avx2(auVar199,auVar199);
                    pCVar5 = conv_params->dst;
                    if (conv_params->do_average == 0) {
                      *(long *)(pCVar5 + lVar48 + lVar86 + 4) = auVar199._0_8_;
                      *(long *)(pCVar5 + lVar48 + lVar73 + 4) = auVar199._16_8_;
                    }
                    else {
                      auVar141._8_8_ = 0;
                      auVar141._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar73 + 4);
                      auVar116._8_8_ = 0;
                      auVar116._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar86 + 4);
                      auVar130._0_16_ = ZEXT116(0) * auVar141 + ZEXT116(1) * auVar116;
                      auVar130._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar141;
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar199 = vpaddw_avx2(auVar199,auVar130);
                        auVar199 = vpsraw_avx2(auVar199,1);
                      }
                      else {
                        auVar199 = vpunpcklwd_avx2(auVar130,auVar199);
                        auVar199 = vpmaddwd_avx2(auVar199,auVar119);
                        auVar199 = vpsrad_avx2(auVar199,4);
                        auVar199 = vpackusdw_avx2(auVar199,auVar199);
                      }
                      auVar199 = vpaddw_avx2(auVar199,auVar97);
                      auVar199 = vpsraw_avx2(auVar199,auVar96);
                      auVar199 = vpackuswb_avx2(auVar199,auVar199);
                      *(int *)(puVar89 + lVar40 * 2 + 4) = auVar199._0_4_;
                      *(int *)(local_550 + lVar40 * 2 + 4) = auVar199._16_4_;
                    }
                  }
                }
                lVar40 = lVar40 + lVar67;
                uVar41 = uVar41 + 2;
                iVar92 = iVar92 + iVar84 * 2;
                pauVar49 = pauVar49 + 1;
                auVar249 = auVar182;
                auVar182 = auVar126;
                local_4d0 = auVar94;
                auVar199 = auVar121;
                auVar121 = auVar131;
                auVar181 = local_400;
              } while (uVar76 != uVar41);
            }
          }
          else if (0 < lVar39) {
            auVar236 = vperm2i128_avx2(local_140,local_120,0x21);
            auVar121 = vpunpckhwd_avx2(local_140,auVar236);
            auVar182 = vperm2i128_avx2(local_160,local_140,0x21);
            auVar199 = vpunpckhwd_avx2(local_160,auVar182);
            auVar255 = vperm2i128_avx2(local_180,local_160,0x21);
            auVar181 = vpunpckhwd_avx2(local_180,auVar255);
            auVar249 = vpunpcklwd_avx2(local_140,auVar236);
            auVar236 = vpunpcklwd_avx2(local_160,auVar182);
            auVar182 = vpunpcklwd_avx2(local_180,auVar255);
            uVar41 = 0xfffffffffffffffe;
            pauVar49 = (undefined1 (*) [32])local_100;
            lVar40 = 0;
            do {
              auVar126 = auVar236;
              auVar148._0_16_ =
                   ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar84 + iVar92 >> 10] +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar92 >> 10];
              auVar148._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar84 + iVar92 >> 10];
              auVar101 = vpshufd_avx2(auVar148,0);
              auVar180 = vpshufd_avx2(auVar148,0x55);
              auVar179 = vpshufd_avx2(auVar148,0xaa);
              auVar103 = vpshufd_avx2(auVar148,0xff);
              auVar236 = pauVar49[-1];
              auVar104 = vperm2i128_avx2(auVar236,*pauVar49,0x21);
              auVar125 = vpunpcklwd_avx2(auVar236,auVar104);
              auVar182 = vpmaddwd_avx2(auVar182,auVar101);
              auVar255 = vpmaddwd_avx2(auVar126,auVar180);
              auVar182 = vpaddd_avx2(auVar255,auVar182);
              auVar255 = vpmaddwd_avx2(auVar179,auVar249);
              auVar131 = vpmaddwd_avx2(auVar103,auVar125);
              auVar255 = vpaddd_avx2(auVar255,auVar131);
              auVar182 = vpaddd_avx2(auVar255,auVar182);
              auVar131 = vpunpckhwd_avx2(auVar236,auVar104);
              auVar181 = vpmaddwd_avx2(auVar181,auVar101);
              auVar236 = vpmaddwd_avx2(auVar180,auVar199);
              auVar181 = vpaddd_avx2(auVar236,auVar181);
              auVar236 = vpmaddwd_avx2(auVar179,auVar121);
              auVar255 = vpmaddwd_avx2(auVar103,auVar131);
              auVar236 = vpaddd_avx2(auVar255,auVar236);
              auVar181 = vpaddd_avx2(auVar181,auVar236);
              auVar255 = vpunpckldq_avx2(auVar182,auVar181);
              auVar236 = vpunpckhdq_avx2(auVar182,auVar181);
              auVar16._4_4_ = iVar74;
              auVar16._0_4_ = iVar74;
              auVar16._8_4_ = iVar74;
              auVar16._12_4_ = iVar74;
              auVar16._16_4_ = iVar74;
              auVar16._20_4_ = iVar74;
              auVar16._24_4_ = iVar74;
              auVar16._28_4_ = iVar74;
              auVar181 = vpaddd_avx2(auVar16,auVar255);
              if (conv_params->is_compound == 0) {
                auVar182 = vpsrad_avx2(auVar181,auVar94);
                auVar181 = vpaddd_avx2(auVar16,auVar236);
                auVar181 = vpsrad_avx2(auVar181,auVar94);
                auVar181 = vpackssdw_avx2(auVar182,auVar181);
                auVar181 = vpackuswb_avx2(auVar181,auVar121);
                if (p_width == 4) {
                  *(int *)(puVar89 + lVar40 * 2) = auVar181._0_4_;
                  *(int *)(local_550 + lVar40 * 2) = auVar181._16_4_;
                }
                else {
                  *(long *)(puVar89 + lVar40 * 2) = auVar181._0_8_;
                  *(long *)(local_550 + lVar40 * 2) = auVar181._16_8_;
                }
              }
              else {
                iVar47 = (int)uVar41;
                lVar86 = (long)((iVar79 + iVar47 + 2) * conv_params->dst_stride);
                pCVar5 = conv_params->dst;
                auVar181 = vpsrad_avx2(auVar181,auVar94);
                lVar73 = (long)((iVar79 + iVar47 + 3) * conv_params->dst_stride);
                auVar181 = vpackusdw_avx2(auVar181,auVar181);
                if (conv_params->do_average == 0) {
                  *(long *)(pCVar5 + lVar48 + lVar86) = auVar181._0_8_;
                  *(long *)(pCVar5 + lVar48 + lVar73) = auVar181._16_8_;
                }
                else {
                  auVar221._8_8_ = 0;
                  auVar221._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar73);
                  auVar214._8_8_ = 0;
                  auVar214._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar86);
                  auVar218._0_16_ = ZEXT116(0) * auVar221 + ZEXT116(1) * auVar214;
                  auVar218._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar221;
                  if (conv_params->use_dist_wtd_comp_avg == 0) {
                    auVar181 = vpaddw_avx2(auVar181,auVar218);
                    auVar181 = vpsraw_avx2(auVar181,1);
                  }
                  else {
                    auVar181 = vpunpcklwd_avx2(auVar218,auVar181);
                    auVar181 = vpmaddwd_avx2(auVar181,auVar119);
                    auVar181 = vpsrad_avx2(auVar181,4);
                    auVar181 = vpackusdw_avx2(auVar181,auVar181);
                  }
                  auVar181 = vpaddw_avx2(auVar181,auVar97);
                  auVar181 = vpsraw_avx2(auVar181,auVar96);
                  auVar181 = vpackuswb_avx2(auVar181,auVar181);
                  *(int *)(puVar89 + lVar40 * 2) = auVar181._0_4_;
                  *(int *)(local_550 + lVar40 * 2) = auVar181._16_4_;
                }
                if (4 < p_width) {
                  lVar86 = (long)((iVar79 + iVar47 + 2) * conv_params->dst_stride);
                  lVar73 = (long)((iVar79 + iVar47 + 3) * conv_params->dst_stride);
                  auVar181 = vpaddd_avx2(auVar16,auVar236);
                  auVar181 = vpsrad_avx2(auVar181,auVar94);
                  auVar181 = vpackusdw_avx2(auVar181,auVar181);
                  pCVar5 = conv_params->dst;
                  if (conv_params->do_average == 0) {
                    *(long *)(pCVar5 + lVar48 + lVar86 + 4) = auVar181._0_8_;
                    *(long *)(pCVar5 + lVar48 + lVar73 + 4) = auVar181._16_8_;
                  }
                  else {
                    auVar215._8_8_ = 0;
                    auVar215._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar73 + 4);
                    auVar205._8_8_ = 0;
                    auVar205._0_8_ = *(ulong *)(pCVar5 + lVar48 + lVar86 + 4);
                    auVar209._0_16_ = ZEXT116(0) * auVar215 + ZEXT116(1) * auVar205;
                    auVar209._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar215;
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar181 = vpaddw_avx2(auVar181,auVar209);
                      auVar181 = vpsraw_avx2(auVar181,1);
                    }
                    else {
                      auVar181 = vpunpcklwd_avx2(auVar209,auVar181);
                      auVar181 = vpmaddwd_avx2(auVar181,auVar119);
                      auVar181 = vpsrad_avx2(auVar181,4);
                      auVar181 = vpackusdw_avx2(auVar181,auVar181);
                    }
                    auVar181 = vpaddw_avx2(auVar181,auVar97);
                    auVar181 = vpsraw_avx2(auVar181,auVar96);
                    auVar181 = vpackuswb_avx2(auVar181,auVar181);
                    *(int *)(puVar89 + lVar40 * 2 + 4) = auVar181._0_4_;
                    *(int *)(local_550 + lVar40 * 2 + 4) = auVar181._16_4_;
                  }
                }
              }
              lVar40 = lVar40 + lVar67;
              uVar41 = uVar41 + 2;
              iVar92 = iVar92 + iVar84 * 2;
              pauVar49 = pauVar49 + 1;
              auVar181 = auVar199;
              auVar199 = auVar121;
              auVar236 = auVar249;
              auVar249 = auVar125;
              auVar121 = auVar131;
              auVar182 = auVar126;
            } while (uVar76 != uVar41);
          }
          lVar48 = lVar48 + 8;
          local_550 = local_550 + 8;
          puVar89 = puVar89 + 8;
          auVar228 = ZEXT1664(auVar225);
          auVar231 = ZEXT3264(local_80);
          auVar238 = ZEXT3264(CONCAT1616(_DAT_00563ce0,_DAT_00563ce0));
          auVar244 = ZEXT3264(CONCAT1616(_DAT_00564440,_DAT_00564440));
          auVar251 = ZEXT3264(CONCAT1616(_DAT_00564450,_DAT_00564450));
          auVar256 = ZEXT3264(CONCAT1616(_DAT_00564460,_DAT_00564460));
        } while (lVar48 < p_width);
      }
      uVar82 = uVar82 + 8;
      p_height = p_height + -8;
      local_340 = local_340 + lVar67 * 8;
      local_3d8 = local_3d8 + lVar67 * 8;
    } while (uVar82 < uVar37);
  }
  return;
}

Assistant:

void av1_warp_affine_avx2(const int32_t *mat, const uint8_t *ref, int width,
                          int height, int stride, uint8_t *pred, int p_col,
                          int p_row, int p_width, int p_height, int p_stride,
                          int subsampling_x, int subsampling_y,
                          ConvolveParams *conv_params, int16_t alpha,
                          int16_t beta, int16_t gamma, int16_t delta) {
  __m256i horz_out[8];
  int i, j, k;
  const int bd = 8;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m256i reduce_bits_vert_const =
      _mm256_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m256i res_add_const = _mm256_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  const __m256i round_const = _mm256_set1_epi16(
      (1 << offset_bits_horiz) + ((1 << reduce_bits_horiz) >> 1));
  const __m128i shift = _mm_cvtsi32_si128(reduce_bits_horiz);

  __m256i res_sub_const, round_bits_const, wt;
  unpack_weights_and_set_round_const_avx2(conv_params, round_bits, offset_bits,
                                          &res_sub_const, &round_bits_const,
                                          &wt);

  __m256i res_add_const_1;
  if (conv_params->is_compound == 1) {
    res_add_const_1 = _mm256_add_epi32(reduce_bits_vert_const, res_add_const);
  } else {
    res_add_const_1 = _mm256_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                        ((1 << reduce_bits_vert) >> 1));
  }
  const int32_t const1 = alpha * (-4) + beta * (-4) +
                         (1 << (WARPEDDIFF_PREC_BITS - 1)) +
                         (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
  const int32_t const2 = gamma * (-4) + delta * (-4) +
                         (1 << (WARPEDDIFF_PREC_BITS - 1)) +
                         (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
  const int32_t const3 = ((1 << WARP_PARAM_REDUCE_BITS) - 1);
  const int16_t const4 = (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1));
  const int16_t const5 = (1 << (FILTER_BITS - reduce_bits_horiz));

  __m256i shuffle_src[4];
  shuffle_src[0] = _mm256_load_si256((__m256i *)shuffle_src0);
  shuffle_src[1] = _mm256_load_si256((__m256i *)shuffle_src1);
  shuffle_src[2] = _mm256_load_si256((__m256i *)shuffle_src2);
  shuffle_src[3] = _mm256_load_si256((__m256i *)shuffle_src3);

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += const1;
      sy4 += const2;

      sx4 &= ~const3;
      sy4 &= ~const3;

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.

      if (ix4 <= -7) {
        int iy, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_0 =
              _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_1 =
              _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
          horz_out[row] = _mm256_blend_epi32(temp_0, temp_1, 0xf0);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        horz_out[row] = _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
      } else if (ix4 >= width + 6) {
        int iy, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_0 = _mm256_set1_epi16(
              const4 + ref[iy * stride + (width - 1)] * const5);
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_1 = _mm256_set1_epi16(
              const4 + ref[iy * stride + (width - 1)] * const5);
          horz_out[row] = _mm256_blend_epi32(temp_0, temp_1, 0xf0);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        horz_out[row] =
            _mm256_set1_epi16(const4 + ref[iy * stride + (width - 1)] * const5);
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;
        int iy, sx, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          __m128i src0 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          __m128i src1 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));

          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src0 = _mm_shuffle_epi8(src0, shuffle_reg_left);
            src1 = _mm_shuffle_epi8(src1, shuffle_reg_left);
          }
          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src0 = _mm_shuffle_epi8(src0, shuffle_reg_right);
            src1 = _mm_shuffle_epi8(src1, shuffle_reg_right);
          }
          sx = sx4 + beta * (k + 4);
          const __m256i src_01 =
              _mm256_inserti128_si256(_mm256_castsi128_si256(src0), src1, 0x1);
          horizontal_filter_avx2(src_01, horz_out, sx, alpha, beta, row,
                                 shuffle_src, &round_const, &shift);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        __m128i src = _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
        if (out_of_boundary_left >= 0) {
          const __m128i shuffle_reg_left =
              _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
          src = _mm_shuffle_epi8(src, shuffle_reg_left);
        }
        if (out_of_boundary_right >= 0) {
          const __m128i shuffle_reg_right =
              _mm_loadu_si128((__m128i *)warp_pad_right[out_of_boundary_right]);
          src = _mm_shuffle_epi8(src, shuffle_reg_right);
        }
        sx = sx4 + beta * (k + 4);
        const __m256i src_01 = _mm256_castsi128_si256(src);
        __m256i coeff[4];
        prepare_horizontal_filter_coeff(alpha, sx, coeff);
        filter_src_pixels_avx2(src_01, horz_out, coeff, shuffle_src,
                               &round_const, &shift, row);
      } else {
        prepare_warp_horizontal_filter_avx2(
            ref, horz_out, stride, ix4, iy4, sx4, alpha, beta, p_height, height,
            i, &round_const, &shift, shuffle_src);
      }

      // Vertical filter
      prepare_warp_vertical_filter_avx2(
          pred, horz_out, conv_params, gamma, delta, p_height, p_stride,
          p_width, i, j, sy4, reduce_bits_vert, &res_add_const_1, round_bits,
          &res_sub_const, &round_bits_const, &wt);
    }
  }
}